

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::aggregateVars(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *lp,
               SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *row,int *i)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  undefined1 uVar4;
  int32_t iVar5;
  int iVar6;
  fpclass_type fVar7;
  int32_t iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  pointer pnVar12;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar13;
  Tolerances *pTVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  Item *pIVar17;
  DataKey *pDVar18;
  int *piVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  bool bVar23;
  bool bVar24;
  int iVar25;
  int iVar26;
  AggregationPS *this_00;
  undefined8 *puVar27;
  byte bVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar33;
  pointer pnVar34;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  *psVar35;
  uint *puVar36;
  cpp_dec_float<200U,_int,_void> *pcVar37;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar38;
  soplex *psVar39;
  undefined4 *puVar40;
  uint *puVar41;
  cpp_dec_float<200U,_int,_void> *pcVar42;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar43;
  fpclass_type fVar44;
  int32_t *piVar45;
  int32_t iVar46;
  fpclass_type fVar47;
  int32_t *piVar48;
  undefined1 uVar49;
  Item *pIVar50;
  long in_FS_OFFSET;
  byte bVar51;
  double dVar52;
  double a;
  Real RVar53;
  uint local_1dd0;
  fpclass_type local_1dcc;
  double local_1da8;
  fpclass_type local_1d78;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  undefined1 local_1d58 [16];
  undefined1 local_1d48 [16];
  undefined1 local_1d38 [16];
  undefined1 local_1d28 [16];
  undefined1 local_1d18 [16];
  uint local_1d08 [3];
  undefined3 uStack_1cfb;
  int iStack_1cf8;
  bool bStack_1cf4;
  undefined8 local_1cf0;
  Item *local_1ce8;
  undefined8 uStack_1ce0;
  long local_1cd0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale1;
  shared_ptr<soplex::Tolerances> local_1b98;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale2;
  cpp_dec_float<200U,_int,_void> local_1b08;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_45;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aggr_const;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  obj_j;
  cpp_dec_float<200U,_int,_void> local_1908;
  undefined1 local_1888 [32];
  undefined1 local_1868 [16];
  undefined1 local_1858 [16];
  undefined1 local_1848 [16];
  undefined1 local_1838 [16];
  undefined1 local_1828 [13];
  undefined3 uStack_181b;
  int iStack_1818;
  bool bStack_1814;
  undefined8 local_1810;
  undefined1 local_1808 [32];
  undefined1 local_17e8 [16];
  undefined1 local_17d8 [16];
  undefined1 local_17c8 [16];
  undefined1 local_17b8 [16];
  undefined1 local_17a8 [13];
  undefined3 uStack_179b;
  int iStack_1798;
  bool bStack_1794;
  undefined8 local_1790;
  cpp_dec_float<200U,_int,_void> local_1788;
  undefined1 local_1708 [32];
  undefined1 local_16e8 [16];
  undefined1 local_16d8 [16];
  undefined1 local_16c8 [16];
  undefined1 local_16b8 [16];
  undefined1 local_16a8 [13];
  undefined3 uStack_169b;
  int iStack_1698;
  bool bStack_1694;
  undefined8 local_1690;
  undefined1 local_1688 [32];
  undefined1 local_1668 [16];
  undefined1 local_1658 [16];
  undefined1 local_1648 [16];
  undefined1 local_1638 [16];
  undefined1 local_1628 [13];
  undefined3 uStack_161b;
  int iStack_1618;
  bool bStack_1614;
  undefined8 local_1610;
  cpp_dec_float<200U,_int,_void> local_1608;
  cpp_dec_float<200U,_int,_void> local_1588;
  cpp_dec_float<200U,_int,_void> local_1508;
  cpp_dec_float<200U,_int,_void> local_1488;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_49;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_46;
  uint local_12fc [27];
  cpp_dec_float<200U,_int,_void> local_1290;
  cpp_dec_float<200U,_int,_void> local_1210;
  cpp_dec_float<200U,_int,_void> local_1190;
  cpp_dec_float<200U,_int,_void> local_1110;
  cpp_dec_float<200U,_int,_void> local_1090;
  cpp_dec_float<200U,_int,_void> local_1010;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_f90;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_f10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_41;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d90;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_c90;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_c10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b90;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a90;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_990;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_910;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_890;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_810;
  uint local_790 [28];
  uint local_720 [28];
  uint local_6b0 [28];
  uint local_640 [28];
  uint local_5d0 [28];
  uint local_560 [28];
  uint local_4f0 [28];
  uint local_480 [28];
  uint local_410 [28];
  uint local_3a0 [28];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  cpp_dec_float<200U,_int,_void> local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_35;
  
  bVar51 = 0;
  iVar25 = *i;
  pnVar12 = (lp->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).right.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar36 = (uint *)(pnVar12 + iVar25);
  pcVar37 = &local_1488;
  for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
    (pcVar37->data)._M_elems[0] = *puVar36;
    puVar36 = puVar36 + 1;
    pcVar37 = (cpp_dec_float<200U,_int,_void> *)((pcVar37->data)._M_elems + 1);
  }
  local_1488.exp = pnVar12[iVar25].m_backend.exp;
  local_1488.neg = pnVar12[iVar25].m_backend.neg;
  local_1488.fpclass = pnVar12[iVar25].m_backend.fpclass;
  local_1488.prec_elem = pnVar12[iVar25].m_backend.prec_elem;
  pNVar13 = row->m_elem;
  iVar25 = pNVar13->idx;
  local_1dd0 = pNVar13[1].idx;
  pNVar33 = pNVar13;
  pcVar37 = &local_1908;
  for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
    (pcVar37->data)._M_elems[0] = (pNVar33->val).m_backend.data._M_elems[0];
    pNVar33 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)((pNVar33->val).m_backend.data._M_elems + 1);
    pcVar37 = (cpp_dec_float<200U,_int,_void> *)((pcVar37->data)._M_elems + 1);
  }
  local_1908.exp = (pNVar13->val).m_backend.exp;
  local_1908.neg = (pNVar13->val).m_backend.neg;
  local_1908.fpclass = (pNVar13->val).m_backend.fpclass;
  local_1908.prec_elem = (pNVar13->val).m_backend.prec_elem;
  pNVar33 = pNVar13 + 1;
  pcVar37 = &local_1b08;
  for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
    (pcVar37->data)._M_elems[0] = (pNVar33->val).m_backend.data._M_elems[0];
    pNVar33 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)((pNVar33->val).m_backend.data._M_elems + 1);
    pcVar37 = (cpp_dec_float<200U,_int,_void> *)((pcVar37->data)._M_elems + 1);
  }
  local_1b08.exp = pNVar13[1].val.m_backend.exp;
  local_1b08.neg = pNVar13[1].val.m_backend.neg;
  local_1b08.fpclass = pNVar13[1].val.m_backend.fpclass;
  local_1b08.prec_elem = pNVar13[1].val.m_backend.prec_elem;
  local_1ce8 = (Item *)CONCAT44(local_1ce8._4_4_,iVar25);
  local_1cd0 = (long)iVar25;
  pnVar12 = (lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).low.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar36 = (uint *)(pnVar12 + local_1cd0);
  pcVar37 = &local_1508;
  for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
    (pcVar37->data)._M_elems[0] = *puVar36;
    puVar36 = puVar36 + 1;
    pcVar37 = (cpp_dec_float<200U,_int,_void> *)((pcVar37->data)._M_elems + 1);
  }
  iVar25 = pnVar12[local_1cd0].m_backend.exp;
  local_1508.exp = iVar25;
  bVar24 = pnVar12[local_1cd0].m_backend.neg;
  local_1508.neg = bVar24;
  fVar44 = pnVar12[local_1cd0].m_backend.fpclass;
  iVar5 = pnVar12[local_1cd0].m_backend.prec_elem;
  local_1508.prec_elem = iVar5;
  local_1508.fpclass = fVar44;
  pnVar34 = (lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).up.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar36 = (uint *)(pnVar34 + local_1cd0);
  pcVar37 = &local_1588;
  for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
    (pcVar37->data)._M_elems[0] = *puVar36;
    puVar36 = puVar36 + 1;
    pcVar37 = (cpp_dec_float<200U,_int,_void> *)((pcVar37->data)._M_elems + 1);
  }
  iVar6 = pnVar34[local_1cd0].m_backend.exp;
  local_1588.exp = iVar6;
  bVar3 = pnVar34[local_1cd0].m_backend.neg;
  local_1588.neg = bVar3;
  fVar7 = pnVar34[local_1cd0].m_backend.fpclass;
  iVar8 = pnVar34[local_1cd0].m_backend.prec_elem;
  local_1588.prec_elem = iVar8;
  local_1588.fpclass = fVar7;
  lVar29 = (long)(int)local_1dd0;
  puVar36 = (uint *)(pnVar12 + lVar29);
  pcVar37 = &local_1608;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    (pcVar37->data)._M_elems[0] = *puVar36;
    puVar36 = puVar36 + 1;
    pcVar37 = (cpp_dec_float<200U,_int,_void> *)((pcVar37->data)._M_elems + 1);
  }
  iVar26 = pnVar12[lVar29].m_backend.exp;
  local_1608.exp = iVar26;
  uVar49 = pnVar12[lVar29].m_backend.neg;
  local_1608.neg = (bool)uVar49;
  fVar47 = pnVar12[lVar29].m_backend.fpclass;
  iVar46 = pnVar12[lVar29].m_backend.prec_elem;
  local_1608.prec_elem = iVar46;
  local_1608.fpclass = fVar47;
  puVar36 = (uint *)(pnVar34 + lVar29);
  pcVar37 = &local_1788;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    (pcVar37->data)._M_elems[0] = *puVar36;
    puVar36 = puVar36 + 1;
    pcVar37 = (cpp_dec_float<200U,_int,_void> *)((pcVar37->data)._M_elems + 1);
  }
  iVar9 = pnVar34[lVar29].m_backend.exp;
  local_1788.exp = iVar9;
  uVar4 = pnVar34[lVar29].m_backend.neg;
  local_1788.neg = (bool)uVar4;
  local_1dcc = pnVar34[lVar29].m_backend.fpclass;
  uVar10 = pnVar34[lVar29].m_backend.prec_elem;
  local_1788.prec_elem = uVar10;
  local_1788.fpclass = local_1dcc;
  pcVar37 = &local_1508;
  puVar36 = local_3a0;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    *puVar36 = (pcVar37->data)._M_elems[0];
    pcVar37 = (cpp_dec_float<200U,_int,_void> *)((pcVar37->data)._M_elems + 1);
    puVar36 = puVar36 + 1;
  }
  pcVar37 = &local_1588;
  puVar36 = local_410;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    *puVar36 = (pcVar37->data)._M_elems[0];
    pcVar37 = (cpp_dec_float<200U,_int,_void> *)((pcVar37->data)._M_elems + 1);
    puVar36 = puVar36 + 1;
  }
  feastol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_1010,this);
  puVar36 = local_3a0;
  psVar39 = (soplex *)local_1688;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    *(uint *)psVar39 = *puVar36;
    puVar36 = puVar36 + (ulong)bVar51 * -2 + 1;
    psVar39 = psVar39 + (ulong)bVar51 * -8 + 4;
  }
  iStack_1618 = iVar25;
  bStack_1614 = bVar24;
  local_1610._4_4_ = iVar5;
  local_1610._0_4_ = fVar44;
  puVar36 = local_410;
  pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)local_1708;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    (pnVar38->m_backend).data._M_elems[0] = *puVar36;
    puVar36 = puVar36 + (ulong)bVar51 * -2 + 1;
    pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
  }
  local_1690._4_4_ = iVar8;
  local_1690._0_4_ = fVar7;
  iStack_1698 = iVar6;
  bStack_1694 = bVar3;
  relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
            (&result_2,(soplex *)local_1688,
             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_1708,
             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)0x0);
  pnVar38 = &result_2;
  psVar35 = &ptr;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    *(uint *)&(psVar35->
              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr = (pnVar38->m_backend).data._M_elems[0];
    pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
    psVar35 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
               *)((long)psVar35 + (ulong)bVar51 * -8 + 4);
  }
  iStack_1cf8 = result_2.m_backend.exp;
  bStack_1cf4 = result_2.m_backend.neg;
  local_1cf0._0_4_ = result_2.m_backend.fpclass;
  local_1cf0._4_4_ = result_2.m_backend.prec_elem;
  if ((result_2.m_backend.neg == true) &&
     ((uint)ptr.
            super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != 0 || result_2.m_backend.fpclass != cpp_dec_float_finite)) {
    bStack_1cf4 = false;
  }
  if ((result_2.m_backend.fpclass != cpp_dec_float_NaN) && (local_1010.fpclass != cpp_dec_float_NaN)
     ) {
    iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       ((cpp_dec_float<200U,_int,_void> *)&ptr,&local_1010);
    if (iVar25 < 1) {
      return OKAY;
    }
    local_1dcc = local_1788.fpclass;
    iVar26 = local_1608.exp;
    uVar49 = local_1608.neg;
    fVar47 = local_1608.fpclass;
    iVar46 = local_1608.prec_elem;
    iVar9 = local_1788.exp;
    uVar4 = local_1788.neg;
    uVar10 = local_1788.prec_elem;
  }
  pcVar37 = &local_1608;
  puVar36 = local_480;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    *puVar36 = (pcVar37->data)._M_elems[0];
    pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
    puVar36 = puVar36 + (ulong)bVar51 * -2 + 1;
  }
  pcVar37 = &local_1788;
  puVar36 = local_4f0;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    *puVar36 = (pcVar37->data)._M_elems[0];
    pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
    puVar36 = puVar36 + (ulong)bVar51 * -2 + 1;
  }
  feastol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_1090,this);
  puVar36 = local_480;
  psVar39 = (soplex *)local_1688;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    *(uint *)psVar39 = *puVar36;
    puVar36 = puVar36 + (ulong)bVar51 * -2 + 1;
    psVar39 = psVar39 + (ulong)bVar51 * -8 + 4;
  }
  iStack_1618 = iVar26;
  bStack_1614 = (bool)uVar49;
  local_1610._4_4_ = iVar46;
  local_1610._0_4_ = fVar47;
  puVar36 = local_4f0;
  pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)local_1708;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    (pnVar38->m_backend).data._M_elems[0] = *puVar36;
    puVar36 = puVar36 + (ulong)bVar51 * -2 + 1;
    pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
  }
  local_1690._4_4_ = uVar10;
  local_1690._0_4_ = local_1dcc;
  iStack_1698 = iVar9;
  bStack_1694 = (bool)uVar4;
  relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
            (&result_2,(soplex *)local_1688,
             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_1708,
             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)(ulong)uVar10);
  pnVar38 = &result_2;
  psVar35 = &ptr;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    *(uint *)&(psVar35->
              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr = (pnVar38->m_backend).data._M_elems[0];
    pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
    psVar35 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
               *)((long)psVar35 + (ulong)bVar51 * -8 + 4);
  }
  iStack_1cf8 = result_2.m_backend.exp;
  bStack_1cf4 = result_2.m_backend.neg;
  local_1cf0._0_4_ = result_2.m_backend.fpclass;
  local_1cf0._4_4_ = result_2.m_backend.prec_elem;
  if ((result_2.m_backend.neg == true) &&
     ((uint)ptr.
            super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != 0 || result_2.m_backend.fpclass != cpp_dec_float_finite)) {
    bStack_1cf4 = false;
  }
  if (((result_2.m_backend.fpclass != cpp_dec_float_NaN) &&
      (local_1090.fpclass != cpp_dec_float_NaN)) &&
     (iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         ((cpp_dec_float<200U,_int,_void> *)&ptr,&local_1090), iVar25 < 1)) {
    return OKAY;
  }
  local_1610._0_4_ = cpp_dec_float_finite;
  local_1610._4_4_ = 0x1c;
  local_1688._0_16_ = (undefined1  [16])0x0;
  local_1688._16_16_ = (undefined1  [16])0x0;
  local_1668 = (undefined1  [16])0x0;
  local_1658 = (undefined1  [16])0x0;
  local_1648 = (undefined1  [16])0x0;
  local_1638 = (undefined1  [16])0x0;
  local_1628 = SUB1613((undefined1  [16])0x0,0);
  uStack_161b = 0;
  iStack_1618 = 0;
  bStack_1614 = false;
  local_1690._0_4_ = cpp_dec_float_finite;
  local_1690._4_4_ = 0x1c;
  local_1708._0_16_ = (undefined1  [16])0x0;
  local_1708._16_16_ = (undefined1  [16])0x0;
  local_16e8 = (undefined1  [16])0x0;
  local_16d8 = (undefined1  [16])0x0;
  local_16c8 = (undefined1  [16])0x0;
  local_16b8 = (undefined1  [16])0x0;
  local_16a8 = SUB1613((undefined1  [16])0x0,0);
  uStack_169b = 0;
  iStack_1698 = 0;
  bStack_1694 = false;
  local_1790._0_4_ = cpp_dec_float_finite;
  local_1790._4_4_ = 0x1c;
  local_1808._0_16_ = (undefined1  [16])0x0;
  local_1808._16_16_ = (undefined1  [16])0x0;
  local_17e8 = (undefined1  [16])0x0;
  local_17d8 = (undefined1  [16])0x0;
  local_17c8 = (undefined1  [16])0x0;
  local_17b8 = (undefined1  [16])0x0;
  local_17a8 = SUB1613((undefined1  [16])0x0,0);
  uStack_179b = 0;
  iStack_1798 = 0;
  bStack_1794 = false;
  local_1810._0_4_ = cpp_dec_float_finite;
  local_1810._4_4_ = 0x1c;
  local_1888._0_16_ = (undefined1  [16])0x0;
  local_1888._16_16_ = (undefined1  [16])0x0;
  local_1868 = (undefined1  [16])0x0;
  local_1858 = (undefined1  [16])0x0;
  local_1848 = (undefined1  [16])0x0;
  local_1838 = (undefined1  [16])0x0;
  local_1828 = SUB1613((undefined1  [16])0x0,0);
  uStack_181b = 0;
  iStack_1818 = 0;
  bStack_1814 = false;
  pcVar37 = &local_1908;
  pcVar42 = &result_2.m_backend;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    (pcVar42->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
    pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
    pcVar42 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar42 + (ulong)bVar51 * -8 + 4);
  }
  result_2.m_backend.exp = local_1908.exp;
  result_2.m_backend.neg = local_1908.neg;
  result_2.m_backend.fpclass = local_1908.fpclass;
  result_2.m_backend.prec_elem = local_1908.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            (&result_2.m_backend,&local_1b08);
  if (result_2.m_backend.fpclass == cpp_dec_float_NaN) {
LAB_0056a609:
    pcVar37 = &local_1908;
    pcVar42 = &result_2.m_backend;
    for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
      (pcVar42->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
      pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
      pcVar42 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar42 + (ulong)bVar51 * -8 + 4);
    }
    result_2.m_backend.exp = local_1908.exp;
    result_2.m_backend.neg = local_1908.neg;
    result_2.m_backend.fpclass = local_1908.fpclass;
    result_2.m_backend.prec_elem = local_1908.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
              (&result_2.m_backend,&local_1b08);
    if (result_2.m_backend.fpclass == cpp_dec_float_NaN) {
LAB_0056d8b8:
      puVar27 = (undefined8 *)__cxa_allocate_exception(0x28);
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_1d58;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&ptr,"XMAISM12 This should never happen.","");
      *puVar27 = &PTR__SPxException_0069d438;
      puVar27[1] = puVar27 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar27 + 1),
                 ptr.
                 super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,(long)&(ptr.
                                 super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi)->_vptr__Sp_counted_base +
                         (long)ptr.
                               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
      *puVar27 = &PTR__SPxException_0069d410;
      __cxa_throw(puVar27,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    local_1cf0._0_4_ = cpp_dec_float_finite;
    local_1cf0._4_4_ = 0x1c;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1d58 = (undefined1  [16])0x0;
    local_1d48 = (undefined1  [16])0x0;
    local_1d38 = (undefined1  [16])0x0;
    local_1d28 = (undefined1  [16])0x0;
    local_1d18 = (undefined1  [16])0x0;
    local_1d08[0] = 0;
    local_1d08[1] = 0;
    stack0xffffffffffffe300 = 0;
    uStack_1cfb = 0;
    iStack_1cf8 = 0;
    bStack_1cf4 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&ptr,0.0);
    iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       (&result_2.m_backend,(cpp_dec_float<200U,_int,_void> *)&ptr);
    if (iVar25 < 1) goto LAB_0056d8b8;
    ::soplex::infinity::__tls_init();
    local_1da8 = *(double *)(in_FS_OFFSET + -8);
    dVar52 = -local_1da8;
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 0x1c;
    result_2.m_backend.data._M_elems._0_16_ = ZEXT416(0);
    result_2.m_backend.data._M_elems[0x18] = 0;
    result_2.m_backend.data._M_elems[0x19] = 0;
    result_2.m_backend.data._M_elems._104_5_ = 0;
    result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    result_2.m_backend.data._M_elems._16_16_ = result_2.m_backend.data._M_elems._0_16_;
    result_2.m_backend.data._M_elems._32_16_ = result_2.m_backend.data._M_elems._0_16_;
    result_2.m_backend.data._M_elems._48_16_ = result_2.m_backend.data._M_elems._0_16_;
    result_2.m_backend.data._M_elems._64_16_ = result_2.m_backend.data._M_elems._0_16_;
    result_2.m_backend.data._M_elems._80_16_ = result_2.m_backend.data._M_elems._0_16_;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&result_2,dVar52);
    if (((local_1608.fpclass == cpp_dec_float_NaN) ||
        (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_1608,&result_2.m_backend), 0 < iVar25)) {
      pcVar37 = &local_1b08;
      pcVar42 = &obj_j.m_backend;
      for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
        (pcVar42->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
        pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
        pcVar42 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar42 + (ulong)bVar51 * -8 + 4);
      }
      obj_j.m_backend.exp = local_1b08.exp;
      obj_j.m_backend.neg = local_1b08.neg;
      obj_j.m_backend.fpclass = local_1b08.fpclass;
      obj_j.m_backend.prec_elem = local_1b08.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&obj_j.m_backend,&local_1608);
      pcVar37 = &local_1488;
      pcVar42 = &aggr_const.m_backend;
      for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
        (pcVar42->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
        pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
        pcVar42 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar42 + (ulong)bVar51 * -8 + 4);
      }
      aggr_const.m_backend.exp = local_1488.exp;
      aggr_const.m_backend.neg = local_1488.neg;
      aggr_const.m_backend.fpclass = local_1488.fpclass;
      aggr_const.m_backend.prec_elem = local_1488.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                (&aggr_const.m_backend,&obj_j.m_backend);
      local_1cf0._0_4_ = cpp_dec_float_finite;
      local_1cf0._4_4_ = 0x1c;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )ZEXT816(0);
      local_1d58 = ZEXT816(0);
      local_1d48 = ZEXT816(0);
      local_1d38 = ZEXT816(0);
      local_1d28 = ZEXT816(0);
      local_1d18 = ZEXT816(0);
      local_1d08[0] = 0;
      local_1d08[1] = 0;
      stack0xffffffffffffe300 = 0;
      uStack_1cfb = 0;
      iStack_1cf8 = 0;
      bStack_1cf4 = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)&ptr,&aggr_const.m_backend,&local_1908);
    }
    else {
      ::soplex::infinity::__tls_init();
      local_1cf0._0_4_ = cpp_dec_float_finite;
      local_1cf0._4_4_ = 0x1c;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )ZEXT816(0);
      local_1d58 = ZEXT816(0);
      local_1d48 = ZEXT816(0);
      local_1d38 = ZEXT816(0);
      local_1d28 = ZEXT816(0);
      local_1d18 = ZEXT816(0);
      local_1d08[0] = 0;
      local_1d08[1] = 0;
      stack0xffffffffffffe300 = 0;
      uStack_1cfb = 0;
      iStack_1cf8 = 0;
      bStack_1cf4 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&ptr,dVar52);
    }
    psVar35 = &ptr;
    puVar40 = (undefined4 *)local_1688;
    for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
      *puVar40 = *(undefined4 *)
                  &(psVar35->
                   super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
      psVar35 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                 *)((long)psVar35 + (ulong)bVar51 * -8 + 4);
      puVar40 = puVar40 + (ulong)bVar51 * -2 + 1;
    }
    iStack_1618 = iStack_1cf8;
    bStack_1614 = bStack_1cf4;
    local_1610._0_4_ = (fpclass_type)local_1cf0;
    local_1610._4_4_ = local_1cf0._4_4_;
    ::soplex::infinity::__tls_init();
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 0x1c;
    result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._16_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._32_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._48_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._64_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._80_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems[0x18] = 0;
    result_2.m_backend.data._M_elems[0x19] = 0;
    result_2.m_backend.data._M_elems._104_5_ = 0;
    result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&result_2,local_1da8);
    if (((local_1788.fpclass == cpp_dec_float_NaN) ||
        (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_1788,&result_2.m_backend), iVar25 < 0)) {
      pcVar37 = &local_1b08;
      pcVar42 = &obj_j.m_backend;
      for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
        (pcVar42->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
        pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
        pcVar42 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar42 + (ulong)bVar51 * -8 + 4);
      }
      obj_j.m_backend.exp = local_1b08.exp;
      obj_j.m_backend.neg = local_1b08.neg;
      obj_j.m_backend.fpclass = local_1b08.fpclass;
      obj_j.m_backend.prec_elem = local_1b08.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&obj_j.m_backend,&local_1788);
      pcVar37 = &local_1488;
      pcVar42 = &aggr_const.m_backend;
      for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
        (pcVar42->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
        pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
        pcVar42 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar42 + (ulong)bVar51 * -8 + 4);
      }
      aggr_const.m_backend.exp = local_1488.exp;
      aggr_const.m_backend.neg = local_1488.neg;
      aggr_const.m_backend.fpclass = local_1488.fpclass;
      aggr_const.m_backend.prec_elem = local_1488.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                (&aggr_const.m_backend,&obj_j.m_backend);
      local_1cf0._0_4_ = cpp_dec_float_finite;
      local_1cf0._4_4_ = 0x1c;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )ZEXT816(0);
      local_1d58 = ZEXT816(0);
      local_1d48 = ZEXT816(0);
      local_1d38 = ZEXT816(0);
      local_1d28 = ZEXT816(0);
      local_1d18 = ZEXT816(0);
      local_1d08[0] = 0;
      local_1d08[1] = 0;
      stack0xffffffffffffe300 = 0;
      uStack_1cfb = 0;
      iStack_1cf8 = 0;
      bStack_1cf4 = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)&ptr,&aggr_const.m_backend,&local_1908);
    }
    else {
      ::soplex::infinity::__tls_init();
      local_1cf0._0_4_ = cpp_dec_float_finite;
      local_1cf0._4_4_ = 0x1c;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )ZEXT816(0);
      local_1d58 = ZEXT816(0);
      local_1d48 = ZEXT816(0);
      local_1d38 = ZEXT816(0);
      local_1d28 = ZEXT816(0);
      local_1d18 = ZEXT816(0);
      local_1d08[0] = 0;
      local_1d08[1] = 0;
      stack0xffffffffffffe300 = 0;
      uStack_1cfb = 0;
      iStack_1cf8 = 0;
      bStack_1cf4 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&ptr,local_1da8);
    }
    psVar35 = &ptr;
    puVar40 = (undefined4 *)local_1708;
    for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
      *puVar40 = *(undefined4 *)
                  &(psVar35->
                   super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
      psVar35 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                 *)((long)psVar35 + (ulong)bVar51 * -8 + 4);
      puVar40 = puVar40 + (ulong)bVar51 * -2 + 1;
    }
    iStack_1698 = iStack_1cf8;
    bStack_1694 = bStack_1cf4;
    local_1690._0_4_ = (fpclass_type)local_1cf0;
    local_1690._4_4_ = local_1cf0._4_4_;
    ::soplex::infinity::__tls_init();
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 0x1c;
    result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._16_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._32_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._48_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._64_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._80_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems[0x18] = 0;
    result_2.m_backend.data._M_elems[0x19] = 0;
    result_2.m_backend.data._M_elems._104_5_ = 0;
    result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&result_2,dVar52);
    if (((local_1508.fpclass == cpp_dec_float_NaN) ||
        (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_1508,&result_2.m_backend), 0 < iVar25)) {
      pcVar37 = &local_1908;
      pcVar42 = &obj_j.m_backend;
      for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
        (pcVar42->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
        pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
        pcVar42 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar42 + (ulong)bVar51 * -8 + 4);
      }
      obj_j.m_backend.exp = local_1908.exp;
      obj_j.m_backend.neg = local_1908.neg;
      obj_j.m_backend.fpclass = local_1908.fpclass;
      obj_j.m_backend.prec_elem = local_1908.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&obj_j.m_backend,&local_1508);
      pcVar37 = &local_1488;
      pcVar42 = &aggr_const.m_backend;
      for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
        (pcVar42->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
        pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
        pcVar42 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar42 + (ulong)bVar51 * -8 + 4);
      }
      aggr_const.m_backend.exp = local_1488.exp;
      aggr_const.m_backend.neg = local_1488.neg;
      aggr_const.m_backend.fpclass = local_1488.fpclass;
      aggr_const.m_backend.prec_elem = local_1488.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                (&aggr_const.m_backend,&obj_j.m_backend);
      local_1cf0._0_4_ = cpp_dec_float_finite;
      local_1cf0._4_4_ = 0x1c;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )ZEXT816(0);
      local_1d58 = ZEXT816(0);
      local_1d48 = ZEXT816(0);
      local_1d38 = ZEXT816(0);
      local_1d28 = ZEXT816(0);
      local_1d18 = ZEXT816(0);
      local_1d08[0] = 0;
      local_1d08[1] = 0;
      stack0xffffffffffffe300 = 0;
      uStack_1cfb = 0;
      iStack_1cf8 = 0;
      bStack_1cf4 = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)&ptr,&aggr_const.m_backend,&local_1b08);
    }
    else {
      ::soplex::infinity::__tls_init();
      local_1cf0._0_4_ = cpp_dec_float_finite;
      local_1cf0._4_4_ = 0x1c;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )ZEXT816(0);
      local_1d58 = ZEXT816(0);
      local_1d48 = ZEXT816(0);
      local_1d38 = ZEXT816(0);
      local_1d28 = ZEXT816(0);
      local_1d18 = ZEXT816(0);
      local_1d08[0] = 0;
      local_1d08[1] = 0;
      stack0xffffffffffffe300 = 0;
      uStack_1cfb = 0;
      iStack_1cf8 = 0;
      bStack_1cf4 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&ptr,dVar52);
    }
    psVar35 = &ptr;
    puVar40 = (undefined4 *)local_1808;
    for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
      *puVar40 = *(undefined4 *)
                  &(psVar35->
                   super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
      psVar35 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                 *)((long)psVar35 + (ulong)bVar51 * -8 + 4);
      puVar40 = puVar40 + (ulong)bVar51 * -2 + 1;
    }
    iStack_1798 = iStack_1cf8;
    bStack_1794 = bStack_1cf4;
    local_1790._0_4_ = (fpclass_type)local_1cf0;
    local_1790._4_4_ = local_1cf0._4_4_;
    ::soplex::infinity::__tls_init();
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 0x1c;
    result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._16_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._32_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._48_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._64_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._80_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems[0x18] = 0;
    result_2.m_backend.data._M_elems[0x19] = 0;
    result_2.m_backend.data._M_elems._104_5_ = 0;
    result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&result_2,local_1da8);
    if (((local_1588.fpclass != cpp_dec_float_NaN) &&
        (result_2.m_backend.fpclass != cpp_dec_float_NaN)) &&
       (iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_1588,&result_2.m_backend), -1 < iVar25)) goto LAB_0056abcd;
    pcVar37 = &local_1908;
    pnVar38 = &obj_j;
    for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
      (pnVar38->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
      pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
      pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
    }
    pcVar37 = &local_1588;
LAB_0056b292:
    obj_j.m_backend.exp = local_1908.exp;
    obj_j.m_backend.neg = local_1908.neg;
    obj_j.m_backend._120_8_ = local_1908._120_8_;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
              (&obj_j.m_backend,pcVar37);
    pcVar37 = &local_1488;
    pcVar42 = &aggr_const.m_backend;
    for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
      (pcVar42->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
      pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
      pcVar42 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar42 + (ulong)bVar51 * -8 + 4);
    }
    aggr_const.m_backend.exp = local_1488.exp;
    aggr_const.m_backend.neg = local_1488.neg;
    aggr_const.m_backend.fpclass = local_1488.fpclass;
    aggr_const.m_backend.prec_elem = local_1488.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
              (&aggr_const.m_backend,&obj_j.m_backend);
    local_1cf0._0_4_ = cpp_dec_float_finite;
    local_1cf0._4_4_ = 0x1c;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
            )ZEXT816(0);
    local_1d58 = ZEXT816(0);
    local_1d48 = ZEXT816(0);
    local_1d38 = ZEXT816(0);
    local_1d28 = ZEXT816(0);
    local_1d18 = ZEXT816(0);
    local_1d08[0] = 0;
    local_1d08[1] = 0;
    stack0xffffffffffffe300 = 0;
    uStack_1cfb = 0;
    iStack_1cf8 = 0;
    bStack_1cf4 = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              ((cpp_dec_float<200U,_int,_void> *)&ptr,&aggr_const.m_backend,&local_1b08);
  }
  else {
    local_1cf0._0_4_ = cpp_dec_float_finite;
    local_1cf0._4_4_ = 0x1c;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1d58 = (undefined1  [16])0x0;
    local_1d48 = (undefined1  [16])0x0;
    local_1d38 = (undefined1  [16])0x0;
    local_1d28 = (undefined1  [16])0x0;
    local_1d18 = (undefined1  [16])0x0;
    local_1d08[0] = 0;
    local_1d08[1] = 0;
    stack0xffffffffffffe300 = 0;
    uStack_1cfb = 0;
    iStack_1cf8 = 0;
    bStack_1cf4 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&ptr,0.0);
    iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       (&result_2.m_backend,(cpp_dec_float<200U,_int,_void> *)&ptr);
    if (-1 < iVar25) goto LAB_0056a609;
    ::soplex::infinity::__tls_init();
    local_1da8 = *(double *)(in_FS_OFFSET + -8);
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 0x1c;
    result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._16_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._32_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._48_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._64_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._80_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems[0x18] = 0;
    result_2.m_backend.data._M_elems[0x19] = 0;
    result_2.m_backend.data._M_elems._104_5_ = 0;
    result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&result_2,local_1da8);
    if (((local_1788.fpclass == cpp_dec_float_NaN) ||
        (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_1788,&result_2.m_backend), iVar25 < 0)) {
      pcVar37 = &local_1b08;
      pcVar42 = &obj_j.m_backend;
      for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
        (pcVar42->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
        pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
        pcVar42 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar42 + (ulong)bVar51 * -8 + 4);
      }
      obj_j.m_backend.exp = local_1b08.exp;
      obj_j.m_backend.neg = local_1b08.neg;
      obj_j.m_backend.fpclass = local_1b08.fpclass;
      obj_j.m_backend.prec_elem = local_1b08.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&obj_j.m_backend,&local_1788);
      pcVar37 = &local_1488;
      pcVar42 = &aggr_const.m_backend;
      for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
        (pcVar42->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
        pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
        pcVar42 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar42 + (ulong)bVar51 * -8 + 4);
      }
      aggr_const.m_backend.exp = local_1488.exp;
      aggr_const.m_backend.neg = local_1488.neg;
      aggr_const.m_backend.fpclass = local_1488.fpclass;
      aggr_const.m_backend.prec_elem = local_1488.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                (&aggr_const.m_backend,&obj_j.m_backend);
      local_1cf0._0_4_ = cpp_dec_float_finite;
      local_1cf0._4_4_ = 0x1c;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )ZEXT816(0);
      local_1d58 = ZEXT816(0);
      local_1d48 = ZEXT816(0);
      local_1d38 = ZEXT816(0);
      local_1d28 = ZEXT816(0);
      local_1d18 = ZEXT816(0);
      local_1d08[0] = 0;
      local_1d08[1] = 0;
      stack0xffffffffffffe300 = 0;
      uStack_1cfb = 0;
      iStack_1cf8 = 0;
      bStack_1cf4 = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)&ptr,&aggr_const.m_backend,&local_1908);
    }
    else {
      ::soplex::infinity::__tls_init();
      local_1cf0._0_4_ = cpp_dec_float_finite;
      local_1cf0._4_4_ = 0x1c;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )ZEXT816(0);
      local_1d58 = ZEXT816(0);
      local_1d48 = ZEXT816(0);
      local_1d38 = ZEXT816(0);
      local_1d28 = ZEXT816(0);
      local_1d18 = ZEXT816(0);
      local_1d08[0] = 0;
      local_1d08[1] = 0;
      stack0xffffffffffffe300 = 0;
      uStack_1cfb = 0;
      iStack_1cf8 = 0;
      bStack_1cf4 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&ptr,-local_1da8);
    }
    psVar35 = &ptr;
    puVar40 = (undefined4 *)local_1688;
    for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
      *puVar40 = *(undefined4 *)
                  &(psVar35->
                   super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
      psVar35 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                 *)((long)psVar35 + (ulong)bVar51 * -8 + 4);
      puVar40 = puVar40 + (ulong)bVar51 * -2 + 1;
    }
    iStack_1618 = iStack_1cf8;
    bStack_1614 = bStack_1cf4;
    local_1610._0_4_ = (fpclass_type)local_1cf0;
    local_1610._4_4_ = local_1cf0._4_4_;
    ::soplex::infinity::__tls_init();
    dVar52 = -local_1da8;
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 0x1c;
    result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._16_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._32_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._48_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._64_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._80_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems[0x18] = 0;
    result_2.m_backend.data._M_elems[0x19] = 0;
    result_2.m_backend.data._M_elems._104_5_ = 0;
    result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&result_2,dVar52);
    if (((local_1608.fpclass == cpp_dec_float_NaN) ||
        (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_1608,&result_2.m_backend), 0 < iVar25)) {
      pcVar37 = &local_1b08;
      pcVar42 = &obj_j.m_backend;
      for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
        (pcVar42->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
        pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
        pcVar42 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar42 + (ulong)bVar51 * -8 + 4);
      }
      obj_j.m_backend.exp = local_1b08.exp;
      obj_j.m_backend.neg = local_1b08.neg;
      obj_j.m_backend.fpclass = local_1b08.fpclass;
      obj_j.m_backend.prec_elem = local_1b08.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&obj_j.m_backend,&local_1608);
      pcVar37 = &local_1488;
      pcVar42 = &aggr_const.m_backend;
      for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
        (pcVar42->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
        pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
        pcVar42 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar42 + (ulong)bVar51 * -8 + 4);
      }
      aggr_const.m_backend.exp = local_1488.exp;
      aggr_const.m_backend.neg = local_1488.neg;
      aggr_const.m_backend.fpclass = local_1488.fpclass;
      aggr_const.m_backend.prec_elem = local_1488.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                (&aggr_const.m_backend,&obj_j.m_backend);
      local_1cf0._0_4_ = cpp_dec_float_finite;
      local_1cf0._4_4_ = 0x1c;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )ZEXT816(0);
      local_1d58 = ZEXT816(0);
      local_1d48 = ZEXT816(0);
      local_1d38 = ZEXT816(0);
      local_1d28 = ZEXT816(0);
      local_1d18 = ZEXT816(0);
      local_1d08[0] = 0;
      local_1d08[1] = 0;
      stack0xffffffffffffe300 = 0;
      uStack_1cfb = 0;
      iStack_1cf8 = 0;
      bStack_1cf4 = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)&ptr,&aggr_const.m_backend,&local_1908);
    }
    else {
      ::soplex::infinity::__tls_init();
      local_1cf0._0_4_ = cpp_dec_float_finite;
      local_1cf0._4_4_ = 0x1c;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )ZEXT816(0);
      local_1d58 = ZEXT816(0);
      local_1d48 = ZEXT816(0);
      local_1d38 = ZEXT816(0);
      local_1d28 = ZEXT816(0);
      local_1d18 = ZEXT816(0);
      local_1d08[0] = 0;
      local_1d08[1] = 0;
      stack0xffffffffffffe300 = 0;
      uStack_1cfb = 0;
      iStack_1cf8 = 0;
      bStack_1cf4 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&ptr,local_1da8);
    }
    psVar35 = &ptr;
    puVar40 = (undefined4 *)local_1708;
    for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
      *puVar40 = *(undefined4 *)
                  &(psVar35->
                   super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
      psVar35 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                 *)((long)psVar35 + (ulong)bVar51 * -8 + 4);
      puVar40 = puVar40 + (ulong)bVar51 * -2 + 1;
    }
    iStack_1698 = iStack_1cf8;
    bStack_1694 = bStack_1cf4;
    local_1690._0_4_ = (fpclass_type)local_1cf0;
    local_1690._4_4_ = local_1cf0._4_4_;
    ::soplex::infinity::__tls_init();
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 0x1c;
    result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._16_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._32_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._48_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._64_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._80_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems[0x18] = 0;
    result_2.m_backend.data._M_elems[0x19] = 0;
    result_2.m_backend.data._M_elems._104_5_ = 0;
    result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&result_2,local_1da8);
    if (((local_1588.fpclass == cpp_dec_float_NaN) ||
        (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_1588,&result_2.m_backend), iVar25 < 0)) {
      pcVar37 = &local_1908;
      pcVar42 = &obj_j.m_backend;
      for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
        (pcVar42->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
        pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
        pcVar42 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar42 + (ulong)bVar51 * -8 + 4);
      }
      obj_j.m_backend.exp = local_1908.exp;
      obj_j.m_backend.neg = local_1908.neg;
      obj_j.m_backend.fpclass = local_1908.fpclass;
      obj_j.m_backend.prec_elem = local_1908.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&obj_j.m_backend,&local_1588);
      pcVar37 = &local_1488;
      pcVar42 = &aggr_const.m_backend;
      for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
        (pcVar42->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
        pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
        pcVar42 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar42 + (ulong)bVar51 * -8 + 4);
      }
      aggr_const.m_backend.exp = local_1488.exp;
      aggr_const.m_backend.neg = local_1488.neg;
      aggr_const.m_backend.fpclass = local_1488.fpclass;
      aggr_const.m_backend.prec_elem = local_1488.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                (&aggr_const.m_backend,&obj_j.m_backend);
      local_1cf0._0_4_ = cpp_dec_float_finite;
      local_1cf0._4_4_ = 0x1c;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )ZEXT816(0);
      local_1d58 = ZEXT816(0);
      local_1d48 = ZEXT816(0);
      local_1d38 = ZEXT816(0);
      local_1d28 = ZEXT816(0);
      local_1d18 = ZEXT816(0);
      local_1d08[0] = 0;
      local_1d08[1] = 0;
      stack0xffffffffffffe300 = 0;
      uStack_1cfb = 0;
      iStack_1cf8 = 0;
      bStack_1cf4 = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)&ptr,&aggr_const.m_backend,&local_1b08);
    }
    else {
      ::soplex::infinity::__tls_init();
      local_1cf0._0_4_ = cpp_dec_float_finite;
      local_1cf0._4_4_ = 0x1c;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )ZEXT816(0);
      local_1d58 = ZEXT816(0);
      local_1d48 = ZEXT816(0);
      local_1d38 = ZEXT816(0);
      local_1d28 = ZEXT816(0);
      local_1d18 = ZEXT816(0);
      local_1d08[0] = 0;
      local_1d08[1] = 0;
      stack0xffffffffffffe300 = 0;
      uStack_1cfb = 0;
      iStack_1cf8 = 0;
      bStack_1cf4 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&ptr,dVar52);
    }
    psVar35 = &ptr;
    puVar40 = (undefined4 *)local_1808;
    for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
      *puVar40 = *(undefined4 *)
                  &(psVar35->
                   super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
      psVar35 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                 *)((long)psVar35 + (ulong)bVar51 * -8 + 4);
      puVar40 = puVar40 + (ulong)bVar51 * -2 + 1;
    }
    iStack_1798 = iStack_1cf8;
    bStack_1794 = bStack_1cf4;
    local_1790._0_4_ = (fpclass_type)local_1cf0;
    local_1790._4_4_ = local_1cf0._4_4_;
    ::soplex::infinity::__tls_init();
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 0x1c;
    result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._16_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._32_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._48_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._64_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._80_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems[0x18] = 0;
    result_2.m_backend.data._M_elems[0x19] = 0;
    result_2.m_backend.data._M_elems._104_5_ = 0;
    result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&result_2,dVar52);
    if (((local_1508.fpclass == cpp_dec_float_NaN) ||
        (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_1508,&result_2.m_backend), 0 < iVar25)) {
      pcVar37 = &local_1908;
      pnVar38 = &obj_j;
      for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
        (pnVar38->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
        pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
        pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
      }
      pcVar37 = &local_1508;
      goto LAB_0056b292;
    }
LAB_0056abcd:
    ::soplex::infinity::__tls_init();
    local_1cf0._0_4_ = cpp_dec_float_finite;
    local_1cf0._4_4_ = 0x1c;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
            )ZEXT816(0);
    local_1d58 = ZEXT816(0);
    local_1d48 = ZEXT816(0);
    local_1d38 = ZEXT816(0);
    local_1d28 = ZEXT816(0);
    local_1d18 = ZEXT816(0);
    local_1d08[0] = 0;
    local_1d08[1] = 0;
    stack0xffffffffffffe300 = 0;
    uStack_1cfb = 0;
    iStack_1cf8 = 0;
    bStack_1cf4 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&ptr,local_1da8);
  }
  psVar35 = &ptr;
  puVar40 = (undefined4 *)local_1888;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    *puVar40 = *(undefined4 *)
                &(psVar35->
                 super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
    psVar35 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
               *)((long)psVar35 + (ulong)bVar51 * -8 + 4);
    puVar40 = puVar40 + (ulong)bVar51 * -2 + 1;
  }
  iStack_1818 = iStack_1cf8;
  bStack_1814 = bStack_1cf4;
  local_1810._0_4_ = (fpclass_type)local_1cf0;
  local_1810._4_4_ = local_1cf0._4_4_;
  ::soplex::infinity::__tls_init();
  dVar52 = *(double *)(in_FS_OFFSET + -8);
  a = -dVar52;
  local_1cf0._0_4_ = cpp_dec_float_finite;
  local_1cf0._4_4_ = 0x1c;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1d58 = (undefined1  [16])0x0;
  local_1d48 = (undefined1  [16])0x0;
  local_1d38 = (undefined1  [16])0x0;
  local_1d28 = (undefined1  [16])0x0;
  local_1d18 = (undefined1  [16])0x0;
  local_1d08[0] = 0;
  local_1d08[1] = 0;
  stack0xffffffffffffe300 = 0;
  uStack_1cfb = 0;
  iStack_1cf8 = 0;
  bStack_1cf4 = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&ptr,a);
  if ((((fpclass_type)local_1610 == cpp_dec_float_NaN) ||
      ((fpclass_type)local_1cf0 == cpp_dec_float_NaN)) ||
     (iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         ((cpp_dec_float<200U,_int,_void> *)local_1688,
                          (cpp_dec_float<200U,_int,_void> *)&ptr), 0 < iVar25)) {
LAB_0056b3e2:
    ::soplex::infinity::__tls_init();
    local_1cf0._0_4_ = cpp_dec_float_finite;
    local_1cf0._4_4_ = 0x1c;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1d58 = (undefined1  [16])0x0;
    local_1d48 = (undefined1  [16])0x0;
    local_1d38 = (undefined1  [16])0x0;
    local_1d28 = (undefined1  [16])0x0;
    local_1d18 = (undefined1  [16])0x0;
    local_1d08[0] = 0;
    local_1d08[1] = 0;
    stack0xffffffffffffe300 = 0;
    uStack_1cfb = 0;
    iStack_1cf8 = 0;
    bStack_1cf4 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&ptr,a);
    lVar30 = lVar29;
    local_1dcc = local_1dd0;
    if ((((fpclass_type)local_1790 == cpp_dec_float_NaN) ||
        ((fpclass_type)local_1cf0 == cpp_dec_float_NaN)) ||
       (iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           ((cpp_dec_float<200U,_int,_void> *)local_1808,
                            (cpp_dec_float<200U,_int,_void> *)&ptr), 0 < iVar25)) {
LAB_0056b466:
      puVar36 = (uint *)local_1688;
      pnVar38 = &local_810;
      for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
        (pnVar38->m_backend).data._M_elems[0] = *puVar36;
        puVar36 = puVar36 + (ulong)bVar51 * -2 + 1;
        pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
      }
      local_810.m_backend.exp = iStack_1618;
      local_810.m_backend.neg = bStack_1614;
      local_810.m_backend.fpclass = (fpclass_type)local_1610;
      local_810.m_backend.prec_elem = local_1610._4_4_;
      pcVar37 = &local_1508;
      pnVar38 = &local_890;
      for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
        (pnVar38->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
        pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
        pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
      }
      local_890.m_backend.exp = local_1508.exp;
      local_890.m_backend.neg = local_1508.neg;
      local_890.m_backend.fpclass = local_1508.fpclass;
      local_890.m_backend.prec_elem = local_1508.prec_elem;
      pTVar14 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      p_Var15 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
        }
      }
      RVar53 = Tolerances::epsilon(pTVar14);
      bVar24 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                         (&local_810,&local_890,RVar53);
      if (bVar24) {
        puVar36 = (uint *)local_1708;
        pnVar38 = &local_910;
        for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
          (pnVar38->m_backend).data._M_elems[0] = *puVar36;
          puVar36 = puVar36 + (ulong)bVar51 * -2 + 1;
          pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
        }
        local_910.m_backend.exp = iStack_1698;
        local_910.m_backend.neg = bStack_1694;
        local_910.m_backend.fpclass = (fpclass_type)local_1690;
        local_910.m_backend.prec_elem = local_1690._4_4_;
        pcVar37 = &local_1588;
        pnVar38 = &local_990;
        for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
          (pnVar38->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
          pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4)
          ;
          pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
        }
        local_990.m_backend.exp = local_1588.exp;
        local_990.m_backend.neg = local_1588.neg;
        local_990.m_backend.fpclass = local_1588.fpclass;
        local_990.m_backend.prec_elem = local_1588.prec_elem;
        pTVar14 = (this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        p_Var16 = (this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
          }
        }
        RVar53 = Tolerances::epsilon(pTVar14);
        bVar24 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                           (&local_910,&local_990,RVar53);
        if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
        }
      }
      else {
        bVar24 = false;
      }
      if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
      }
      if (bVar24 == false) {
        puVar36 = (uint *)local_1808;
        pnVar38 = &local_c10;
        for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
          (pnVar38->m_backend).data._M_elems[0] = *puVar36;
          puVar36 = puVar36 + (ulong)bVar51 * -2 + 1;
          pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
        }
        local_c10.m_backend.exp = iStack_1798;
        local_c10.m_backend.neg = bStack_1794;
        local_c10.m_backend.fpclass = (fpclass_type)local_1790;
        local_c10.m_backend.prec_elem = local_1790._4_4_;
        pcVar37 = &local_1608;
        pnVar38 = &local_c90;
        for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
          (pnVar38->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
          pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4)
          ;
          pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
        }
        local_c90.m_backend.exp = local_1608.exp;
        local_c90.m_backend.neg = local_1608.neg;
        local_c90.m_backend.fpclass = local_1608.fpclass;
        local_c90.m_backend.prec_elem = local_1608.prec_elem;
        pTVar14 = (this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        p_Var15 = (this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
          }
        }
        RVar53 = Tolerances::epsilon(pTVar14);
        bVar24 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                           (&local_c10,&local_c90,RVar53);
        if (bVar24) {
          puVar36 = (uint *)local_1888;
          pnVar38 = &local_d10;
          for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
            (pnVar38->m_backend).data._M_elems[0] = *puVar36;
            puVar36 = puVar36 + (ulong)bVar51 * -2 + 1;
            pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
          }
          local_d10.m_backend.exp = iStack_1818;
          local_d10.m_backend.neg = bStack_1814;
          local_d10.m_backend.fpclass = (fpclass_type)local_1810;
          local_d10.m_backend.prec_elem = local_1810._4_4_;
          pcVar37 = &local_1788;
          pnVar38 = &local_d90;
          for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
            (pnVar38->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
            pcVar37 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
            pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
          }
          local_d90.m_backend.exp = local_1788.exp;
          local_d90.m_backend.neg = local_1788.neg;
          local_d90.m_backend.fpclass = local_1788.fpclass;
          local_d90.m_backend.prec_elem = local_1788.prec_elem;
          pTVar14 = (this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          p_Var16 = (this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
            }
          }
          RVar53 = Tolerances::epsilon(pTVar14);
          bVar24 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                             (&local_d10,&local_d90,RVar53);
          if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
          }
        }
        else {
          bVar24 = false;
        }
        if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
        }
        if (bVar24 == false) {
          pcVar37 = &local_1908;
          psVar35 = &ptr;
          for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
            *(uint *)&(psVar35->
                      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr = (pcVar37->data)._M_elems[0];
            pcVar37 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
            psVar35 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                       *)((long)psVar35 + (ulong)bVar51 * -8 + 4);
          }
          iStack_1cf8 = local_1908.exp;
          bStack_1cf4 = local_1908.neg;
          local_1cf0._0_4_ = local_1908.fpclass;
          local_1cf0._4_4_ = local_1908.prec_elem;
          fVar44 = local_1908.fpclass;
          if ((local_1908.neg == true) &&
             ((uint)ptr.
                    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr != 0 || fVar44 != cpp_dec_float_finite)) {
            bStack_1cf4 = false;
          }
          pcVar37 = &local_1b08;
          pnVar38 = &result_2;
          for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
            (pnVar38->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
            pcVar37 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
            pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
          }
          result_2.m_backend.exp = local_1b08.exp;
          result_2.m_backend.neg = local_1b08.neg;
          result_2.m_backend.fpclass = local_1b08.fpclass;
          result_2.m_backend.prec_elem = local_1b08.prec_elem;
          if ((local_1b08.neg == true) &&
             (result_2.m_backend.data._M_elems[0] != 0 || local_1b08.fpclass != cpp_dec_float_finite
             )) {
            result_2.m_backend.neg = false;
          }
          if (local_1b08.fpclass != cpp_dec_float_NaN && fVar44 != cpp_dec_float_NaN)
          goto LAB_0056bbf3;
        }
      }
      else {
        puVar36 = (uint *)local_1808;
        pnVar38 = &local_a10;
        for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
          (pnVar38->m_backend).data._M_elems[0] = *puVar36;
          puVar36 = puVar36 + (ulong)bVar51 * -2 + 1;
          pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
        }
        local_a10.m_backend.exp = iStack_1798;
        local_a10.m_backend.neg = bStack_1794;
        local_a10.m_backend.fpclass = (fpclass_type)local_1790;
        local_a10.m_backend.prec_elem = local_1790._4_4_;
        pcVar37 = &local_1608;
        pnVar38 = &local_a90;
        for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
          (pnVar38->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
          pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4)
          ;
          pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
        }
        local_a90.m_backend.exp = local_1608.exp;
        local_a90.m_backend.neg = local_1608.neg;
        local_a90.m_backend.fpclass = local_1608.fpclass;
        local_a90.m_backend.prec_elem = local_1608.prec_elem;
        pTVar14 = (this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        p_Var15 = (this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
          }
        }
        RVar53 = Tolerances::epsilon(pTVar14);
        bVar24 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                           (&local_a10,&local_a90,RVar53);
        if (bVar24) {
          puVar36 = (uint *)local_1888;
          pnVar38 = &local_b10;
          for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
            (pnVar38->m_backend).data._M_elems[0] = *puVar36;
            puVar36 = puVar36 + (ulong)bVar51 * -2 + 1;
            pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
          }
          local_b10.m_backend.exp = iStack_1818;
          local_b10.m_backend.neg = bStack_1814;
          local_b10.m_backend.fpclass = (fpclass_type)local_1810;
          local_b10.m_backend.prec_elem = local_1810._4_4_;
          pcVar37 = &local_1788;
          pnVar38 = &local_b90;
          for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
            (pnVar38->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
            pcVar37 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
            pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
          }
          local_b90.m_backend.exp = local_1788.exp;
          local_b90.m_backend.neg = local_1788.neg;
          local_b90.m_backend.fpclass = local_1788.fpclass;
          local_b90.m_backend.prec_elem = local_1788.prec_elem;
          pTVar14 = (this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          p_Var16 = (this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
            }
          }
          RVar53 = Tolerances::epsilon(pTVar14);
          bVar24 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                             (&local_b10,&local_b90,RVar53);
          if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
          }
        }
        else {
          bVar24 = false;
        }
        if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
        }
        if (bVar24 == false) goto LAB_0056bad9;
        pcVar37 = &local_1908;
        psVar35 = &ptr;
        for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
          *(uint *)&(psVar35->
                    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr = (pcVar37->data)._M_elems[0];
          pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4)
          ;
          psVar35 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                     *)((long)psVar35 + (ulong)bVar51 * -8 + 4);
        }
        iStack_1cf8 = local_1908.exp;
        bStack_1cf4 = local_1908.neg;
        local_1cf0._0_4_ = local_1908.fpclass;
        local_1cf0._4_4_ = local_1908.prec_elem;
        fVar44 = local_1908.fpclass;
        if ((local_1908.neg == true) &&
           ((uint)ptr.
                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr != 0 || fVar44 != cpp_dec_float_finite)) {
          bStack_1cf4 = false;
        }
        pcVar37 = &local_1b08;
        pnVar38 = &result_2;
        for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
          (pnVar38->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
          pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4)
          ;
          pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
        }
        result_2.m_backend.exp = local_1b08.exp;
        result_2.m_backend.neg = local_1b08.neg;
        result_2.m_backend.fpclass = local_1b08.fpclass;
        result_2.m_backend.prec_elem = local_1b08.prec_elem;
        if ((local_1b08.neg == true) &&
           (result_2.m_backend.data._M_elems[0] != 0 || local_1b08.fpclass != cpp_dec_float_finite))
        {
          result_2.m_backend.neg = false;
        }
        if (local_1b08.fpclass != cpp_dec_float_NaN && fVar44 != cpp_dec_float_NaN) {
LAB_0056bbf3:
          result_2.m_backend.exp = local_1b08.exp;
          result_2.m_backend._120_8_ = local_1b08._120_8_;
          iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             ((cpp_dec_float<200U,_int,_void> *)&ptr,&result_2.m_backend);
          if (0 < iVar25) {
            local_1dd0 = (fpclass_type)local_1ce8;
            lVar29 = local_1cd0;
            goto LAB_0056bda2;
          }
        }
      }
      goto LAB_0056bc33;
    }
    ::soplex::infinity::__tls_init();
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 0x1c;
    result_2.m_backend.data._M_elems[0] = 0;
    result_2.m_backend.data._M_elems[1] = 0;
    result_2.m_backend.data._M_elems[2] = 0;
    result_2.m_backend.data._M_elems[3] = 0;
    result_2.m_backend.data._M_elems[4] = 0;
    result_2.m_backend.data._M_elems[5] = 0;
    result_2.m_backend.data._M_elems[6] = 0;
    result_2.m_backend.data._M_elems[7] = 0;
    result_2.m_backend.data._M_elems[8] = 0;
    result_2.m_backend.data._M_elems[9] = 0;
    result_2.m_backend.data._M_elems[10] = 0;
    result_2.m_backend.data._M_elems[0xb] = 0;
    result_2.m_backend.data._M_elems[0xc] = 0;
    result_2.m_backend.data._M_elems[0xd] = 0;
    result_2.m_backend.data._M_elems[0xe] = 0;
    result_2.m_backend.data._M_elems[0xf] = 0;
    result_2.m_backend.data._M_elems[0x10] = 0;
    result_2.m_backend.data._M_elems[0x11] = 0;
    result_2.m_backend.data._M_elems[0x12] = 0;
    result_2.m_backend.data._M_elems[0x13] = 0;
    result_2.m_backend.data._M_elems[0x14] = 0;
    result_2.m_backend.data._M_elems[0x15] = 0;
    result_2.m_backend.data._M_elems[0x16] = 0;
    result_2.m_backend.data._M_elems[0x17] = 0;
    result_2.m_backend.data._M_elems[0x18] = 0;
    result_2.m_backend.data._M_elems[0x19] = 0;
    result_2.m_backend.data._M_elems._104_5_ = 0;
    result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&result_2,dVar52);
    if ((((fpclass_type)local_1810 == cpp_dec_float_NaN) ||
        (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           ((cpp_dec_float<200U,_int,_void> *)local_1888,&result_2.m_backend),
       iVar25 < 0)) goto LAB_0056b466;
LAB_0056bad9:
    local_1dd0 = (fpclass_type)local_1ce8;
    lVar29 = local_1cd0;
  }
  else {
    ::soplex::infinity::__tls_init();
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 0x1c;
    result_2.m_backend.data._M_elems[0] = 0;
    result_2.m_backend.data._M_elems[1] = 0;
    result_2.m_backend.data._M_elems[2] = 0;
    result_2.m_backend.data._M_elems[3] = 0;
    result_2.m_backend.data._M_elems[4] = 0;
    result_2.m_backend.data._M_elems[5] = 0;
    result_2.m_backend.data._M_elems[6] = 0;
    result_2.m_backend.data._M_elems[7] = 0;
    result_2.m_backend.data._M_elems[8] = 0;
    result_2.m_backend.data._M_elems[9] = 0;
    result_2.m_backend.data._M_elems[10] = 0;
    result_2.m_backend.data._M_elems[0xb] = 0;
    result_2.m_backend.data._M_elems[0xc] = 0;
    result_2.m_backend.data._M_elems[0xd] = 0;
    result_2.m_backend.data._M_elems[0xe] = 0;
    result_2.m_backend.data._M_elems[0xf] = 0;
    result_2.m_backend.data._M_elems[0x10] = 0;
    result_2.m_backend.data._M_elems[0x11] = 0;
    result_2.m_backend.data._M_elems[0x12] = 0;
    result_2.m_backend.data._M_elems[0x13] = 0;
    result_2.m_backend.data._M_elems[0x14] = 0;
    result_2.m_backend.data._M_elems[0x15] = 0;
    result_2.m_backend.data._M_elems[0x16] = 0;
    result_2.m_backend.data._M_elems[0x17] = 0;
    result_2.m_backend.data._M_elems[0x18] = 0;
    result_2.m_backend.data._M_elems[0x19] = 0;
    result_2.m_backend.data._M_elems._104_5_ = 0;
    result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&result_2,dVar52);
    if ((((fpclass_type)local_1690 == cpp_dec_float_NaN) ||
        (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           ((cpp_dec_float<200U,_int,_void> *)local_1708,&result_2.m_backend),
       iVar25 < 0)) goto LAB_0056b3e2;
LAB_0056bc33:
    pcVar37 = &local_1908;
    psVar35 = &ptr;
    for (lVar30 = 0x1c; bVar24 = local_1908.neg, iVar25 = local_1908.exp, lVar30 != 0;
        lVar30 = lVar30 + -1) {
      *(uint *)&(psVar35->
                super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr = (pcVar37->data)._M_elems[0];
      pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
      psVar35 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                 *)((long)psVar35 + (ulong)bVar51 * -8 + 4);
    }
    pcVar37 = &local_1508;
    pnVar38 = &result_2;
    for (lVar30 = 0x1c; bVar3 = local_1508.neg, iVar6 = local_1508.exp, lVar30 != 0;
        lVar30 = lVar30 + -1) {
      (pnVar38->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
      pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
      pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
    }
    pcVar37 = &local_1588;
    pnVar38 = &aggr_const;
    for (lVar30 = 0x1c; bVar23 = local_1588.neg, iVar26 = local_1588.exp, lVar30 != 0;
        lVar30 = lVar30 + -1) {
      (pnVar38->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
      pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
      pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
    }
    pcVar37 = &local_1b08;
    pcVar42 = &local_1908;
    for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
      (pcVar42->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
      pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
      pcVar42 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar42 + ((ulong)bVar51 * -2 + 1) * 4);
    }
    local_1908.exp = local_1b08.exp;
    local_1908.neg = local_1b08.neg;
    psVar35 = &ptr;
    pcVar37 = &local_1b08;
    for (lVar30 = 0x1c; uVar20 = local_1908._120_8_, lVar30 != 0; lVar30 = lVar30 + -1) {
      (pcVar37->data)._M_elems[0] =
           *(uint *)&(psVar35->
                     super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr;
      psVar35 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                 *)((long)psVar35 + (ulong)bVar51 * -8 + 4);
      pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
    }
    local_1908.fpclass = local_1b08.fpclass;
    local_1908.prec_elem = local_1b08.prec_elem;
    uVar21 = local_1908._120_8_;
    local_1b08.exp = iVar25;
    local_1b08.neg = bVar24;
    local_1908.fpclass = (fpclass_type)uVar20;
    local_1908.prec_elem = SUB84(uVar20,4);
    local_1b08.fpclass = local_1908.fpclass;
    local_1b08.prec_elem = local_1908.prec_elem;
    pcVar37 = &local_1608;
    pcVar42 = &local_1508;
    for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
      (pcVar42->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
      pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
      pcVar42 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar42 + ((ulong)bVar51 * -2 + 1) * 4);
    }
    local_1508.exp = local_1608.exp;
    local_1508.neg = local_1608.neg;
    pnVar38 = &result_2;
    pcVar37 = &local_1608;
    for (lVar30 = 0x1c; uVar20 = local_1508._120_8_, lVar30 != 0; lVar30 = lVar30 + -1) {
      (pcVar37->data)._M_elems[0] = (pnVar38->m_backend).data._M_elems[0];
      pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
      pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
    }
    local_1508.fpclass = local_1608.fpclass;
    local_1508.prec_elem = local_1608.prec_elem;
    uVar22 = local_1508._120_8_;
    local_1608.exp = iVar6;
    local_1608.neg = bVar3;
    local_1508.fpclass = (fpclass_type)uVar20;
    local_1508.prec_elem = SUB84(uVar20,4);
    local_1608.fpclass = local_1508.fpclass;
    local_1608.prec_elem = local_1508.prec_elem;
    pcVar37 = &local_1788;
    pcVar42 = &local_1588;
    local_1508._120_8_ = uVar22;
    for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
      (pcVar42->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
      pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
      pcVar42 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar42 + ((ulong)bVar51 * -2 + 1) * 4);
    }
    local_1588.exp = local_1788.exp;
    local_1588.neg = local_1788.neg;
    pnVar38 = &aggr_const;
    pcVar37 = &local_1788;
    for (lVar30 = 0x1c; uVar20 = local_1588._120_8_, lVar30 != 0; lVar30 = lVar30 + -1) {
      (pcVar37->data)._M_elems[0] = (pnVar38->m_backend).data._M_elems[0];
      pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
      pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
    }
    local_1588.fpclass = local_1788.fpclass;
    local_1588.prec_elem = local_1788.prec_elem;
    uVar22 = local_1588._120_8_;
    local_1788.exp = iVar26;
    local_1788.neg = bVar23;
    local_1588.fpclass = (fpclass_type)uVar20;
    local_1588.prec_elem = SUB84(uVar20,4);
    local_1788.fpclass = local_1588.fpclass;
    local_1788.prec_elem = local_1588.prec_elem;
    local_1dcc = (fpclass_type)local_1ce8;
    lVar30 = local_1cd0;
    local_1908._120_8_ = uVar21;
    local_1588._120_8_ = uVar22;
  }
LAB_0056bda2:
  pIVar17 = (lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.theitem;
  pDVar18 = (lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thekey;
  iVar25 = pDVar18[lVar29].idx;
  local_1ce8 = (Item *)(long)pDVar18[lVar30].idx;
  local_1cf0._0_4_ = cpp_dec_float_finite;
  local_1cf0._4_4_ = 0x1c;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1d58 = (undefined1  [16])0x0;
  local_1d48 = (undefined1  [16])0x0;
  local_1d38 = (undefined1  [16])0x0;
  local_1d28 = (undefined1  [16])0x0;
  local_1d18 = (undefined1  [16])0x0;
  local_1d08[0] = 0;
  local_1d08[1] = 0;
  stack0xffffffffffffe300 = 0;
  uStack_1cfb = 0;
  iStack_1cf8 = 0;
  bStack_1cf4 = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)&ptr,&local_1b08,&local_1908);
  uVar20 = local_1cf0;
  iVar6 = iStack_1cf8;
  uVar10 = (uint)ptr.
                 super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
  puVar36 = (uint *)((long)&ptr.
                            super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr + 4);
  puVar41 = local_12fc;
  for (lVar30 = 0x1b; lVar30 != 0; lVar30 = lVar30 + -1) {
    *puVar41 = *puVar36;
    puVar36 = puVar36 + (ulong)bVar51 * -2 + 1;
    puVar41 = puVar41 + (ulong)bVar51 * -2 + 1;
  }
  bVar28 = ((uint)ptr.
                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr != 0 || (fpclass_type)local_1cf0 != cpp_dec_float_finite) ^ bStack_1cf4;
  aggr_const.m_backend.fpclass = cpp_dec_float_finite;
  aggr_const.m_backend.prec_elem = 0x1c;
  aggr_const.m_backend.data._M_elems[0] = 0;
  aggr_const.m_backend.data._M_elems[1] = 0;
  aggr_const.m_backend.data._M_elems[2] = 0;
  aggr_const.m_backend.data._M_elems[3] = 0;
  aggr_const.m_backend.data._M_elems[4] = 0;
  aggr_const.m_backend.data._M_elems[5] = 0;
  aggr_const.m_backend.data._M_elems[6] = 0;
  aggr_const.m_backend.data._M_elems[7] = 0;
  aggr_const.m_backend.data._M_elems[8] = 0;
  aggr_const.m_backend.data._M_elems[9] = 0;
  aggr_const.m_backend.data._M_elems[10] = 0;
  aggr_const.m_backend.data._M_elems[0xb] = 0;
  aggr_const.m_backend.data._M_elems[0xc] = 0;
  aggr_const.m_backend.data._M_elems[0xd] = 0;
  aggr_const.m_backend.data._M_elems[0xe] = 0;
  aggr_const.m_backend.data._M_elems[0xf] = 0;
  aggr_const.m_backend.data._M_elems[0x10] = 0;
  aggr_const.m_backend.data._M_elems[0x11] = 0;
  aggr_const.m_backend.data._M_elems[0x12] = 0;
  aggr_const.m_backend.data._M_elems[0x13] = 0;
  aggr_const.m_backend.data._M_elems[0x14] = 0;
  aggr_const.m_backend.data._M_elems[0x15] = 0;
  aggr_const.m_backend.data._M_elems[0x16] = 0;
  aggr_const.m_backend.data._M_elems[0x17] = 0;
  aggr_const.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
  aggr_const.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  aggr_const.m_backend.exp = 0;
  aggr_const.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&aggr_const.m_backend,&local_1488,&local_1908);
  if (0 < pIVar17[iVar25].data.
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused) {
    pIVar50 = pIVar17 + (long)local_1ce8;
    lVar30 = 0;
    local_1ce8 = pIVar50;
    do {
      pNVar13 = pIVar17[iVar25].data.
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .m_elem;
      uVar11 = pNVar13[lVar30].idx;
      pNVar33 = pNVar13 + lVar30;
      pcVar37 = (cpp_dec_float<200U,_int,_void> *)&ptr;
      for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
        (pcVar37->data)._M_elems[0] = (pNVar33->val).m_backend.data._M_elems[0];
        pNVar33 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pNVar33 + ((ulong)bVar51 * -2 + 1) * 4);
        pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar51 * -8 + 4);
      }
      iStack_1cf8 = pNVar13[lVar30].val.m_backend.exp;
      bStack_1cf4 = pNVar13[lVar30].val.m_backend.neg;
      local_1cf0._0_4_ = pNVar13[lVar30].val.m_backend.fpclass;
      local_1cf0._4_4_ = pNVar13[lVar30].val.m_backend.prec_elem;
      if (uVar11 != *i) {
        pnVar12 = (lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).left.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar34 = pnVar12 + (int)uVar11;
        pnVar38 = &result_2;
        for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
          (pnVar38->m_backend).data._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
          pnVar34 = (pointer)((long)pnVar34 + ((ulong)bVar51 * -2 + 1) * 4);
          pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
        }
        result_2.m_backend.exp = pnVar12[(int)uVar11].m_backend.exp;
        result_2.m_backend.neg = pnVar12[(int)uVar11].m_backend.neg;
        result_2.m_backend.fpclass = pnVar12[(int)uVar11].m_backend.fpclass;
        result_2.m_backend.prec_elem = pnVar12[(int)uVar11].m_backend.prec_elem;
        pnVar12 = (lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).right.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar34 = pnVar12 + (int)uVar11;
        pnVar38 = &obj_j;
        for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
          (pnVar38->m_backend).data._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
          pnVar34 = (pointer)((long)pnVar34 + ((ulong)bVar51 * -2 + 1) * 4);
          pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
        }
        obj_j.m_backend.exp = pnVar12[(int)uVar11].m_backend.exp;
        obj_j.m_backend.neg = pnVar12[(int)uVar11].m_backend.neg;
        obj_j.m_backend.fpclass = pnVar12[(int)uVar11].m_backend.fpclass;
        obj_j.m_backend.prec_elem = pnVar12[(int)uVar11].m_backend.prec_elem;
        ::soplex::infinity::__tls_init();
        scale1.m_backend.fpclass = cpp_dec_float_finite;
        scale1.m_backend.prec_elem = 0x1c;
        scale1.m_backend.data._M_elems[0] = 0;
        scale1.m_backend.data._M_elems[1] = 0;
        scale1.m_backend.data._M_elems[2] = 0;
        scale1.m_backend.data._M_elems[3] = 0;
        scale1.m_backend.data._M_elems[4] = 0;
        scale1.m_backend.data._M_elems[5] = 0;
        scale1.m_backend.data._M_elems[6] = 0;
        scale1.m_backend.data._M_elems[7] = 0;
        scale1.m_backend.data._M_elems[8] = 0;
        scale1.m_backend.data._M_elems[9] = 0;
        scale1.m_backend.data._M_elems[10] = 0;
        scale1.m_backend.data._M_elems[0xb] = 0;
        scale1.m_backend.data._M_elems[0xc] = 0;
        scale1.m_backend.data._M_elems[0xd] = 0;
        scale1.m_backend.data._M_elems[0xe] = 0;
        scale1.m_backend.data._M_elems[0xf] = 0;
        scale1.m_backend.data._M_elems[0x10] = 0;
        scale1.m_backend.data._M_elems[0x11] = 0;
        scale1.m_backend.data._M_elems[0x12] = 0;
        scale1.m_backend.data._M_elems[0x13] = 0;
        scale1.m_backend.data._M_elems[0x14] = 0;
        scale1.m_backend.data._M_elems[0x15] = 0;
        scale1.m_backend.data._M_elems[0x16] = 0;
        scale1.m_backend.data._M_elems[0x17] = 0;
        scale1.m_backend.data._M_elems[0x18] = 0;
        scale1.m_backend.data._M_elems[0x19] = 0;
        scale1.m_backend.data._M_elems._104_5_ = 0;
        scale1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        scale1.m_backend.exp = 0;
        scale1.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&scale1.m_backend,a);
        if (((result_2.m_backend.fpclass != cpp_dec_float_NaN) &&
            (scale1.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar26 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&result_2.m_backend,&scale1.m_backend), 0 < iVar26)) {
          pnVar38 = &aggr_const;
          pcVar37 = &scale2.m_backend;
          for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
            (pcVar37->data)._M_elems[0] = (pnVar38->m_backend).data._M_elems[0];
            pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
            pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar51 * -8 + 4);
          }
          scale2.m_backend.exp = aggr_const.m_backend.exp;
          scale2.m_backend.neg = aggr_const.m_backend.neg;
          scale2.m_backend.fpclass = aggr_const.m_backend.fpclass;
          scale2.m_backend.prec_elem = aggr_const.m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&scale2.m_backend,(cpp_dec_float<200U,_int,_void> *)&ptr);
          pIVar50 = local_1ce8;
          pnVar38 = &result_2;
          pcVar37 = &scale1.m_backend;
          for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
            (pcVar37->data)._M_elems[0] = (pnVar38->m_backend).data._M_elems[0];
            pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
            pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar51 * -8 + 4);
          }
          scale1.m_backend.exp = result_2.m_backend.exp;
          scale1.m_backend.neg = result_2.m_backend.neg;
          scale1.m_backend.fpclass = result_2.m_backend.fpclass;
          scale1.m_backend.prec_elem = result_2.m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&scale1.m_backend,&scale2.m_backend);
          (*(lp->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x33])(lp,(ulong)uVar11,&scale1.m_backend,0);
          piVar19 = &(this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).m_chgLRhs;
          *piVar19 = *piVar19 + 1;
        }
        ::soplex::infinity::__tls_init();
        scale1.m_backend.fpclass = cpp_dec_float_finite;
        scale1.m_backend.prec_elem = 0x1c;
        scale1.m_backend.data._M_elems._0_16_ = ZEXT816(0);
        scale1.m_backend.data._M_elems._16_16_ = ZEXT816(0);
        scale1.m_backend.data._M_elems._32_16_ = ZEXT816(0);
        scale1.m_backend.data._M_elems._48_16_ = ZEXT816(0);
        scale1.m_backend.data._M_elems._64_16_ = ZEXT816(0);
        scale1.m_backend.data._M_elems._80_16_ = ZEXT816(0);
        scale1.m_backend.data._M_elems[0x18] = 0;
        scale1.m_backend.data._M_elems[0x19] = 0;
        scale1.m_backend.data._M_elems._104_5_ = 0;
        scale1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        scale1.m_backend.exp = 0;
        scale1.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&scale1.m_backend,dVar52);
        if (((obj_j.m_backend.fpclass != cpp_dec_float_NaN) &&
            (scale1.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar26 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&obj_j.m_backend,&scale1.m_backend), iVar26 < 0)) {
          pnVar38 = &aggr_const;
          pcVar37 = &scale2.m_backend;
          for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
            (pcVar37->data)._M_elems[0] = (pnVar38->m_backend).data._M_elems[0];
            pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
            pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar51 * -8 + 4);
          }
          scale2.m_backend.exp = aggr_const.m_backend.exp;
          scale2.m_backend.neg = aggr_const.m_backend.neg;
          scale2.m_backend.fpclass = aggr_const.m_backend.fpclass;
          scale2.m_backend.prec_elem = aggr_const.m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&scale2.m_backend,(cpp_dec_float<200U,_int,_void> *)&ptr);
          pIVar50 = local_1ce8;
          pnVar38 = &obj_j;
          pcVar37 = &scale1.m_backend;
          for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
            (pcVar37->data)._M_elems[0] = (pnVar38->m_backend).data._M_elems[0];
            pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
            pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar51 * -8 + 4);
          }
          scale1.m_backend.exp = obj_j.m_backend.exp;
          scale1.m_backend.neg = obj_j.m_backend.neg;
          scale1.m_backend.fpclass = obj_j.m_backend.fpclass;
          scale1.m_backend.prec_elem = obj_j.m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&scale1.m_backend,&scale2.m_backend);
          (*(lp->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x36])(lp,(ulong)uVar11,&scale1.m_backend,0);
          piVar19 = &(this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).m_chgLRhs;
          *piVar19 = *piVar19 + 1;
        }
        uVar21 = local_1cf0;
        scale1.m_backend.data._M_elems[0] = uVar10;
        puVar36 = local_12fc;
        puVar41 = scale1.m_backend.data._M_elems + 1;
        for (lVar31 = 0x1b; lVar31 != 0; lVar31 = lVar31 + -1) {
          *puVar41 = *puVar36;
          puVar36 = puVar36 + (ulong)bVar51 * -2 + 1;
          puVar41 = puVar41 + (ulong)bVar51 * -2 + 1;
        }
        scale1.m_backend.exp = iVar6;
        local_1cf0._0_4_ = (fpclass_type)uVar20;
        local_1cf0._4_4_ = SUB84(uVar20,4);
        scale1.m_backend.fpclass = (fpclass_type)local_1cf0;
        scale1.m_backend.prec_elem = local_1cf0._4_4_;
        local_1cf0 = uVar21;
        scale1.m_backend.neg = (bool)bVar28;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  (&scale1.m_backend,(cpp_dec_float<200U,_int,_void> *)&ptr);
        pNVar13 = (pIVar50->data).
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .m_elem;
        if ((pNVar13 !=
             (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)0x0) &&
           (lVar31 = (long)(pIVar50->data).
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .memused, 0 < lVar31)) {
          lVar32 = 0;
LAB_0056c316:
          if (*(uint *)((long)(&pNVar13->val + 1) + lVar32) != uVar11) goto code_r0x0056c320;
          puVar36 = (uint *)((long)(pNVar13->val).m_backend.data._M_elems + lVar32);
          pcVar37 = &scale2.m_backend;
          for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
            (pcVar37->data)._M_elems[0] = *puVar36;
            puVar36 = puVar36 + (ulong)bVar51 * -2 + 1;
            pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar51 * -8 + 4);
          }
          scale2.m_backend.exp = *(int *)((long)(&(pNVar13->val).m_backend.data + 1) + lVar32);
          scale2.m_backend.neg = *(bool *)((long)(&(pNVar13->val).m_backend.data + 1) + lVar32 + 4);
          scale2.m_backend._120_8_ =
               *(undefined8 *)((long)(&(pNVar13->val).m_backend.data + 1) + lVar32 + 8);
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    (&scale1.m_backend,&scale2.m_backend);
          piVar19 = &(this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).m_remNzos;
          *piVar19 = *piVar19 + 1;
        }
LAB_0056c37a:
        (*(lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x43])(lp,(ulong)uVar11,(ulong)local_1dcc,&scale1.m_backend,0);
      }
      lVar30 = lVar30 + 1;
    } while (lVar30 < pIVar17[iVar25].data.
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::obj(&obj_j,lp,local_1dd0);
  uVar21 = obj_j.m_backend._120_8_;
  bVar24 = obj_j.m_backend.neg;
  iVar25 = obj_j.m_backend.exp;
  pnVar38 = &obj_j;
  puVar36 = local_560;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    *puVar36 = (pnVar38->m_backend).data._M_elems[0];
    pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
    puVar36 = puVar36 + (ulong)bVar51 * -2 + 1;
  }
  local_1ce8 = (Item *)obj_j.m_backend._120_8_;
  uStack_1ce0 = 0;
  epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_1110,this);
  puVar36 = local_560;
  psVar35 = &ptr;
  for (lVar30 = 0x1c; uVar22 = obj_j.m_backend._120_8_, lVar30 != 0; lVar30 = lVar30 + -1) {
    *(uint *)&(psVar35->
              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr = *puVar36;
    puVar36 = puVar36 + (ulong)bVar51 * -2 + 1;
    psVar35 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
               *)((long)psVar35 + (ulong)bVar51 * -8 + 4);
  }
  iStack_1cf8 = iVar25;
  bStack_1cf4 = bVar24;
  obj_j.m_backend.fpclass = (fpclass_type)uVar21;
  obj_j.m_backend.prec_elem = SUB84(uVar21,4);
  local_1cf0._0_4_ = obj_j.m_backend.fpclass;
  local_1cf0._4_4_ = obj_j.m_backend.prec_elem;
  if ((bVar24 == true) &&
     ((uint)ptr.
            super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != 0 || (fpclass_type)local_1ce8 != cpp_dec_float_finite)) {
    bStack_1cf4 = false;
  }
  obj_j.m_backend._120_8_ = uVar22;
  if ((((fpclass_type)local_1ce8 != cpp_dec_float_NaN) && (local_1110.fpclass != cpp_dec_float_NaN))
     && (iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)&ptr,&local_1110), 0 < iVar25)) {
    pnVar38 = &aggr_const;
    pcVar37 = &result_35.m_backend;
    for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
      (pcVar37->data)._M_elems[0] = (pnVar38->m_backend).data._M_elems[0];
      pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
      pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar51 * -8 + 4);
    }
    result_35.m_backend.exp = aggr_const.m_backend.exp;
    result_35.m_backend.neg = aggr_const.m_backend.neg;
    result_35.m_backend.fpclass = aggr_const.m_backend.fpclass;
    result_35.m_backend.prec_elem = aggr_const.m_backend.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
              (&result_35.m_backend,&obj_j.m_backend);
    (*(this->
      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      )._vptr_SPxSimplifier[0x11])(this,&result_35.m_backend);
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&ptr,lp,local_1dcc);
    uVar21 = local_1cf0;
    scale1.m_backend.data._M_elems[0] = uVar10;
    puVar36 = local_12fc;
    puVar41 = scale1.m_backend.data._M_elems + 1;
    for (lVar30 = 0x1b; lVar30 != 0; lVar30 = lVar30 + -1) {
      *puVar41 = *puVar36;
      puVar36 = puVar36 + (ulong)bVar51 * -2 + 1;
      puVar41 = puVar41 + (ulong)bVar51 * -2 + 1;
    }
    scale1.m_backend.exp = iVar6;
    local_1cf0._0_4_ = (fpclass_type)uVar20;
    local_1cf0._4_4_ = SUB84(uVar20,4);
    scale1.m_backend.fpclass = (fpclass_type)local_1cf0;
    scale1.m_backend.prec_elem = local_1cf0._4_4_;
    local_1cf0 = uVar21;
    scale1.m_backend.neg = (bool)bVar28;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
              (&scale1.m_backend,&obj_j.m_backend);
    pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&ptr;
    pcVar37 = &result_2.m_backend;
    for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
      (pcVar37->data)._M_elems[0] = (pnVar38->m_backend).data._M_elems[0];
      pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
      pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar51 * -8 + 4);
    }
    result_2.m_backend.exp = iStack_1cf8;
    result_2.m_backend.neg = bStack_1cf4;
    result_2.m_backend.fpclass = (fpclass_type)local_1cf0;
    result_2.m_backend.prec_elem = local_1cf0._4_4_;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
              (&result_2.m_backend,&scale1.m_backend);
    (*(lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x24])(lp,(ulong)local_1dcc,&result_2.m_backend,0);
  }
  uVar20 = local_1488._120_8_;
  bVar24 = local_1488.neg;
  iVar25 = local_1488.exp;
  pcVar37 = &local_1488;
  puVar36 = local_5d0;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    *puVar36 = (pcVar37->data)._M_elems[0];
    pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
    puVar36 = puVar36 + (ulong)bVar51 * -2 + 1;
  }
  pcVar37 = &local_1908;
  pcVar42 = &result_38.m_backend;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    (pcVar42->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
    pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
    pcVar42 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar42 + (ulong)bVar51 * -8 + 4);
  }
  result_38.m_backend.exp = local_1908.exp;
  result_38.m_backend.neg = local_1908.neg;
  result_38.m_backend.fpclass = local_1908.fpclass;
  result_38.m_backend.prec_elem = local_1908.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            (&result_38.m_backend,&local_1588);
  puVar36 = local_5d0;
  psVar35 = &ptr;
  for (lVar30 = 0x1c; uVar21 = local_1488._120_8_, lVar30 != 0; lVar30 = lVar30 + -1) {
    *(uint *)&(psVar35->
              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr = *puVar36;
    puVar36 = puVar36 + (ulong)bVar51 * -2 + 1;
    psVar35 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
               *)((long)psVar35 + (ulong)bVar51 * -8 + 4);
  }
  iStack_1cf8 = iVar25;
  bStack_1cf4 = bVar24;
  local_1488.fpclass = (fpclass_type)uVar20;
  local_1488.prec_elem = SUB84(uVar20,4);
  local_1cf0._0_4_ = local_1488.fpclass;
  local_1cf0._4_4_ = local_1488.prec_elem;
  local_1d78 = (fpclass_type)uVar20;
  if ((bVar24 == true) &&
     ((uint)ptr.
            super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != 0 || local_1d78 != cpp_dec_float_finite)) {
    bStack_1cf4 = false;
  }
  pnVar38 = &result_38;
  pnVar43 = &result_2;
  local_1488._120_8_ = uVar21;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    (pnVar43->m_backend).data._M_elems[0] = (pnVar38->m_backend).data._M_elems[0];
    pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
    pnVar43 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar43 + ((ulong)bVar51 * -2 + 1) * 4);
  }
  result_2.m_backend.exp = result_38.m_backend.exp;
  result_2.m_backend.neg = result_38.m_backend.neg;
  result_2.m_backend.fpclass = result_38.m_backend.fpclass;
  result_2.m_backend.prec_elem = result_38.m_backend.prec_elem;
  fVar44 = result_38.m_backend.fpclass;
  if ((result_38.m_backend.neg == true) &&
     (fVar44 != cpp_dec_float_finite || result_2.m_backend.data._M_elems[0] != 0)) {
    result_2.m_backend.neg = false;
  }
  piVar48 = (int32_t *)((long)&local_1cf0 + 4);
  if (fVar44 == cpp_dec_float_NaN || local_1d78 == cpp_dec_float_NaN) {
LAB_0056c714:
    piVar45 = &result_2.m_backend.prec_elem;
    pnVar38 = &result_2;
    pnVar43 = &scale1;
    for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
      (pnVar43->m_backend).data._M_elems[0] = (pnVar38->m_backend).data._M_elems[0];
      pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
      pnVar43 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar43 + ((ulong)bVar51 * -2 + 1) * 4);
    }
    scale1.m_backend.exp = result_2.m_backend.exp;
    scale1.m_backend.neg = result_2.m_backend.neg;
    scale1.m_backend.fpclass = fVar44;
  }
  else {
    iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       ((cpp_dec_float<200U,_int,_void> *)&ptr,&result_2.m_backend);
    if (iVar25 < 1) {
      fVar44 = result_2.m_backend.fpclass;
      goto LAB_0056c714;
    }
    psVar35 = &ptr;
    pnVar38 = &scale1;
    for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
      (pnVar38->m_backend).data._M_elems[0] =
           *(uint *)&(psVar35->
                     super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr;
      psVar35 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                 *)((long)psVar35 + (ulong)bVar51 * -8 + 4);
      pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
    }
    scale1.m_backend.exp = iStack_1cf8;
    scale1.m_backend.neg = bStack_1cf4;
    scale1.m_backend.fpclass = (fpclass_type)local_1cf0;
    piVar45 = piVar48;
  }
  uVar20 = local_1488._120_8_;
  bVar24 = local_1488.neg;
  iVar25 = local_1488.exp;
  scale1.m_backend.prec_elem = *piVar45;
  pcVar37 = &local_1488;
  puVar36 = local_640;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    *puVar36 = (pcVar37->data)._M_elems[0];
    pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
    puVar36 = puVar36 + (ulong)bVar51 * -2 + 1;
  }
  pcVar37 = &local_1908;
  pcVar42 = &result_41.m_backend;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    (pcVar42->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
    pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
    pcVar42 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar42 + (ulong)bVar51 * -8 + 4);
  }
  result_41.m_backend.exp = local_1908.exp;
  result_41.m_backend.neg = local_1908.neg;
  result_41.m_backend.fpclass = local_1908.fpclass;
  result_41.m_backend.prec_elem = local_1908.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            (&result_41.m_backend,&local_1508);
  puVar36 = local_640;
  psVar35 = &ptr;
  for (lVar30 = 0x1c; uVar21 = local_1488._120_8_, lVar30 != 0; lVar30 = lVar30 + -1) {
    *(uint *)&(psVar35->
              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr = *puVar36;
    puVar36 = puVar36 + (ulong)bVar51 * -2 + 1;
    psVar35 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
               *)((long)psVar35 + (ulong)bVar51 * -8 + 4);
  }
  iStack_1cf8 = iVar25;
  bStack_1cf4 = bVar24;
  local_1488.fpclass = (fpclass_type)uVar20;
  local_1488.prec_elem = SUB84(uVar20,4);
  local_1cf0._0_4_ = local_1488.fpclass;
  local_1cf0._4_4_ = local_1488.prec_elem;
  local_1d78 = (fpclass_type)uVar20;
  if ((bVar24 == true) &&
     ((uint)ptr.
            super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != 0 || local_1d78 != cpp_dec_float_finite)) {
    bStack_1cf4 = false;
  }
  pnVar38 = &result_41;
  pnVar43 = &result_2;
  local_1488._120_8_ = uVar21;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    (pnVar43->m_backend).data._M_elems[0] = (pnVar38->m_backend).data._M_elems[0];
    pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
    pnVar43 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar43 + ((ulong)bVar51 * -2 + 1) * 4);
  }
  result_2.m_backend.exp = result_41.m_backend.exp;
  result_2.m_backend.neg = result_41.m_backend.neg;
  result_2.m_backend.fpclass = result_41.m_backend.fpclass;
  result_2.m_backend.prec_elem = result_41.m_backend.prec_elem;
  fVar44 = result_41.m_backend.fpclass;
  if ((result_41.m_backend.neg == true) &&
     (fVar44 != cpp_dec_float_finite || result_2.m_backend.data._M_elems[0] != 0)) {
    result_2.m_backend.neg = false;
  }
  if (fVar44 == cpp_dec_float_NaN || local_1d78 == cpp_dec_float_NaN) {
LAB_0056c8e5:
    piVar48 = &result_2.m_backend.prec_elem;
    pnVar38 = &result_2;
    pnVar43 = &scale2;
    for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
      (pnVar43->m_backend).data._M_elems[0] = (pnVar38->m_backend).data._M_elems[0];
      pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
      pnVar43 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar43 + ((ulong)bVar51 * -2 + 1) * 4);
    }
    scale2.m_backend.exp = result_2.m_backend.exp;
    scale2.m_backend.neg = result_2.m_backend.neg;
    scale2.m_backend.fpclass = fVar44;
  }
  else {
    iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       ((cpp_dec_float<200U,_int,_void> *)&ptr,&result_2.m_backend);
    if (iVar25 < 1) {
      fVar44 = result_2.m_backend.fpclass;
      goto LAB_0056c8e5;
    }
    psVar35 = &ptr;
    pnVar38 = &scale2;
    for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
      (pnVar38->m_backend).data._M_elems[0] =
           *(uint *)&(psVar35->
                     super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr;
      psVar35 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                 *)((long)psVar35 + (ulong)bVar51 * -8 + 4);
      pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
    }
    scale2.m_backend.exp = iStack_1cf8;
    scale2.m_backend.neg = bStack_1cf4;
    scale2.m_backend.fpclass = (fpclass_type)local_1cf0;
  }
  scale2.m_backend.prec_elem = *piVar48;
  if (scale1.m_backend.fpclass != cpp_dec_float_NaN) {
    local_1cf0._0_4_ = cpp_dec_float_finite;
    local_1cf0._4_4_ = 0x1c;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1d58 = (undefined1  [16])0x0;
    local_1d48 = (undefined1  [16])0x0;
    local_1d38 = (undefined1  [16])0x0;
    local_1d28 = (undefined1  [16])0x0;
    local_1d18 = (undefined1  [16])0x0;
    local_1d08[0] = 0;
    local_1d08[1] = 0;
    stack0xffffffffffffe300 = 0;
    uStack_1cfb = 0;
    iStack_1cf8 = 0;
    bStack_1cf4 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&ptr,1.0);
    iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       (&scale1.m_backend,(cpp_dec_float<200U,_int,_void> *)&ptr);
    if (iVar25 < 0) {
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&scale1,1.0);
    }
  }
  if (scale2.m_backend.fpclass != cpp_dec_float_NaN) {
    local_1cf0._0_4_ = cpp_dec_float_finite;
    local_1cf0._4_4_ = 0x1c;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1d58 = (undefined1  [16])0x0;
    local_1d48 = (undefined1  [16])0x0;
    local_1d38 = (undefined1  [16])0x0;
    local_1d28 = (undefined1  [16])0x0;
    local_1d18 = (undefined1  [16])0x0;
    local_1d08[0] = 0;
    local_1d08[1] = 0;
    stack0xffffffffffffe300 = 0;
    uStack_1cfb = 0;
    iStack_1cf8 = 0;
    bStack_1cf4 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&ptr,1.0);
    iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       (&scale2.m_backend,(cpp_dec_float<200U,_int,_void> *)&ptr);
    if (iVar25 < 0) {
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&scale2,1.0);
    }
  }
  local_1cf0._0_4_ = cpp_dec_float_finite;
  local_1cf0._4_4_ = 0x1c;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1d58 = (undefined1  [16])0x0;
  local_1d48 = (undefined1  [16])0x0;
  local_1d38 = (undefined1  [16])0x0;
  local_1d28 = (undefined1  [16])0x0;
  local_1d18 = (undefined1  [16])0x0;
  local_1d08[0] = 0;
  local_1d08[1] = 0;
  stack0xffffffffffffe300 = 0;
  uStack_1cfb = 0;
  iStack_1cf8 = 0;
  bStack_1cf4 = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)&ptr,&local_1488,&scale1.m_backend);
  pcVar37 = &local_1908;
  pcVar42 = &result_45.m_backend;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    (pcVar42->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
    pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
    pcVar42 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar42 + (ulong)bVar51 * -8 + 4);
  }
  result_45.m_backend.exp = local_1908.exp;
  result_45.m_backend.neg = local_1908.neg;
  result_45.m_backend.fpclass = local_1908.fpclass;
  result_45.m_backend.prec_elem = local_1908.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            (&result_45.m_backend,&local_1588);
  result_46.m_backend.fpclass = cpp_dec_float_finite;
  result_46.m_backend.prec_elem = 0x1c;
  result_46.m_backend.data._M_elems[0] = 0;
  result_46.m_backend.data._M_elems[1] = 0;
  result_46.m_backend.data._M_elems[2] = 0;
  result_46.m_backend.data._M_elems[3] = 0;
  result_46.m_backend.data._M_elems[4] = 0;
  result_46.m_backend.data._M_elems[5] = 0;
  result_46.m_backend.data._M_elems[6] = 0;
  result_46.m_backend.data._M_elems[7] = 0;
  result_46.m_backend.data._M_elems[8] = 0;
  result_46.m_backend.data._M_elems[9] = 0;
  result_46.m_backend.data._M_elems[10] = 0;
  result_46.m_backend.data._M_elems[0xb] = 0;
  result_46.m_backend.data._M_elems[0xc] = 0;
  result_46.m_backend.data._M_elems[0xd] = 0;
  result_46.m_backend.data._M_elems[0xe] = 0;
  result_46.m_backend.data._M_elems[0xf] = 0;
  result_46.m_backend.data._M_elems[0x10] = 0;
  result_46.m_backend.data._M_elems[0x11] = 0;
  result_46.m_backend.data._M_elems[0x12] = 0;
  result_46.m_backend.data._M_elems[0x13] = 0;
  result_46.m_backend.data._M_elems[0x14] = 0;
  result_46.m_backend.data._M_elems[0x15] = 0;
  result_46.m_backend.data._M_elems[0x16] = 0;
  result_46.m_backend.data._M_elems[0x17] = 0;
  result_46.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
  result_46.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result_46.m_backend.exp = 0;
  result_46.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result_46.m_backend,&result_45.m_backend,&scale1.m_backend);
  pcVar37 = (cpp_dec_float<200U,_int,_void> *)&ptr;
  pcVar42 = &result_2.m_backend;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    (pcVar42->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
    pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar51 * -8 + 4);
    pcVar42 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar42 + (ulong)bVar51 * -8 + 4);
  }
  result_2.m_backend.exp = iStack_1cf8;
  result_2.m_backend.neg = bStack_1cf4;
  result_2.m_backend.fpclass = (fpclass_type)local_1cf0;
  result_2.m_backend.prec_elem = local_1cf0._4_4_;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
            (&result_2.m_backend,&result_46.m_backend);
  local_1cf0._0_4_ = cpp_dec_float_finite;
  local_1cf0._4_4_ = 0x1c;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1d58 = (undefined1  [16])0x0;
  local_1d48 = (undefined1  [16])0x0;
  local_1d38 = (undefined1  [16])0x0;
  local_1d28 = (undefined1  [16])0x0;
  local_1d18 = (undefined1  [16])0x0;
  local_1d08[0] = 0;
  local_1d08[1] = 0;
  stack0xffffffffffffe300 = 0;
  uStack_1cfb = 0;
  iStack_1cf8 = 0;
  bStack_1cf4 = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)&ptr,&local_1488,&scale2.m_backend);
  pcVar37 = &local_1908;
  pcVar42 = &result_49.m_backend;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    (pcVar42->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
    pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
    pcVar42 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar42 + (ulong)bVar51 * -8 + 4);
  }
  result_49.m_backend.exp = local_1908.exp;
  result_49.m_backend.neg = local_1908.neg;
  result_49.m_backend.fpclass = local_1908.fpclass;
  result_49.m_backend.prec_elem = local_1908.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            (&result_49.m_backend,&local_1508);
  result_45.m_backend.fpclass = cpp_dec_float_finite;
  result_45.m_backend.prec_elem = 0x1c;
  result_45.m_backend.data._M_elems[0] = 0;
  result_45.m_backend.data._M_elems[1] = 0;
  result_45.m_backend.data._M_elems[2] = 0;
  result_45.m_backend.data._M_elems[3] = 0;
  result_45.m_backend.data._M_elems[4] = 0;
  result_45.m_backend.data._M_elems[5] = 0;
  result_45.m_backend.data._M_elems[6] = 0;
  result_45.m_backend.data._M_elems[7] = 0;
  result_45.m_backend.data._M_elems[8] = 0;
  result_45.m_backend.data._M_elems[9] = 0;
  result_45.m_backend.data._M_elems[10] = 0;
  result_45.m_backend.data._M_elems[0xb] = 0;
  result_45.m_backend.data._M_elems[0xc] = 0;
  result_45.m_backend.data._M_elems[0xd] = 0;
  result_45.m_backend.data._M_elems[0xe] = 0;
  result_45.m_backend.data._M_elems[0xf] = 0;
  result_45.m_backend.data._M_elems[0x10] = 0;
  result_45.m_backend.data._M_elems[0x11] = 0;
  result_45.m_backend.data._M_elems[0x12] = 0;
  result_45.m_backend.data._M_elems[0x13] = 0;
  result_45.m_backend.data._M_elems[0x14] = 0;
  result_45.m_backend.data._M_elems[0x15] = 0;
  result_45.m_backend.data._M_elems[0x16] = 0;
  result_45.m_backend.data._M_elems[0x17] = 0;
  result_45.m_backend.data._M_elems[0x18] = 0;
  result_45.m_backend.data._M_elems[0x19] = 0;
  result_45.m_backend.data._M_elems._104_5_ = 0;
  result_45.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result_45.m_backend.exp = 0;
  result_45.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result_45.m_backend,&result_49.m_backend,&scale2.m_backend);
  pcVar37 = (cpp_dec_float<200U,_int,_void> *)&ptr;
  pcVar42 = &result_46.m_backend;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    (pcVar42->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
    pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar51 * -8 + 4);
    pcVar42 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar42 + (ulong)bVar51 * -8 + 4);
  }
  result_46.m_backend.exp = iStack_1cf8;
  result_46.m_backend.neg = bStack_1cf4;
  result_46.m_backend.fpclass = (fpclass_type)local_1cf0;
  result_46.m_backend.prec_elem = local_1cf0._4_4_;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
            (&result_46.m_backend,&result_45.m_backend);
  uVar20 = result_2.m_backend._120_8_;
  bVar24 = result_2.m_backend.neg;
  iVar25 = result_2.m_backend.exp;
  pcVar37 = &result_2.m_backend;
  puVar36 = local_6b0;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    *puVar36 = (pcVar37->data)._M_elems[0];
    pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar51 * -8 + 4);
    puVar36 = puVar36 + (ulong)bVar51 * -2 + 1;
  }
  epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_1190,this);
  puVar36 = local_6b0;
  psVar35 = &ptr;
  for (lVar30 = 0x1c; uVar21 = result_2.m_backend._120_8_, lVar30 != 0; lVar30 = lVar30 + -1) {
    *(uint *)&(psVar35->
              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr = *puVar36;
    puVar36 = puVar36 + (ulong)bVar51 * -2 + 1;
    psVar35 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
               *)((long)psVar35 + (ulong)bVar51 * -8 + 4);
  }
  iStack_1cf8 = iVar25;
  bStack_1cf4 = bVar24;
  result_2.m_backend.fpclass = (fpclass_type)uVar20;
  result_2.m_backend.prec_elem = SUB84(uVar20,4);
  local_1cf0._0_4_ = result_2.m_backend.fpclass;
  local_1cf0._4_4_ = result_2.m_backend.prec_elem;
  local_1d78 = (fpclass_type)uVar20;
  if ((bVar24 == true) &&
     ((uint)ptr.
            super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != 0 || local_1d78 != cpp_dec_float_finite)) {
    bStack_1cf4 = false;
  }
  result_2.m_backend._120_8_ = uVar21;
  if (((local_1d78 != cpp_dec_float_NaN) && (local_1190.fpclass != cpp_dec_float_NaN)) &&
     (iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         ((cpp_dec_float<200U,_int,_void> *)&ptr,&local_1190), iVar25 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&result_2,0.0);
  }
  uVar20 = result_46.m_backend._120_8_;
  bVar24 = result_46.m_backend.neg;
  iVar25 = result_46.m_backend.exp;
  pnVar38 = &result_46;
  puVar36 = local_720;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    *puVar36 = (pnVar38->m_backend).data._M_elems[0];
    pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
    puVar36 = puVar36 + (ulong)bVar51 * -2 + 1;
  }
  epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_1210,this);
  puVar36 = local_720;
  psVar35 = &ptr;
  for (lVar30 = 0x1c; uVar21 = result_46.m_backend._120_8_, lVar30 != 0; lVar30 = lVar30 + -1) {
    *(uint *)&(psVar35->
              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr = *puVar36;
    puVar36 = puVar36 + (ulong)bVar51 * -2 + 1;
    psVar35 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
               *)((long)psVar35 + (ulong)bVar51 * -8 + 4);
  }
  iStack_1cf8 = iVar25;
  bStack_1cf4 = bVar24;
  result_46.m_backend.fpclass = (fpclass_type)uVar20;
  result_46.m_backend.prec_elem = SUB84(uVar20,4);
  local_1cf0._0_4_ = result_46.m_backend.fpclass;
  local_1cf0._4_4_ = result_46.m_backend.prec_elem;
  local_1d78 = (fpclass_type)uVar20;
  if ((bVar24 == true) &&
     ((uint)ptr.
            super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != 0 || local_1d78 != cpp_dec_float_finite)) {
    bStack_1cf4 = false;
  }
  result_46.m_backend._120_8_ = uVar21;
  if (((local_1d78 != cpp_dec_float_NaN) && (local_1210.fpclass != cpp_dec_float_NaN)) &&
     (iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         ((cpp_dec_float<200U,_int,_void> *)&ptr,&local_1210), iVar25 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&result_46,0.0);
  }
  pcVar37 = &local_1b08;
  pcVar42 = &result_45.m_backend;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    (pcVar42->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
    pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
    pcVar42 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar42 + (ulong)bVar51 * -8 + 4);
  }
  result_45.m_backend.exp = local_1b08.exp;
  result_45.m_backend.neg = local_1b08.neg;
  result_45.m_backend.fpclass = local_1b08.fpclass;
  result_45.m_backend.prec_elem = local_1b08.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            (&result_45.m_backend,&local_1908);
  if (result_45.m_backend.fpclass == cpp_dec_float_NaN) {
LAB_0056cf4e:
    pcVar37 = &local_1b08;
    pcVar42 = &result_45.m_backend;
    for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
      (pcVar42->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
      pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
      pcVar42 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar42 + (ulong)bVar51 * -8 + 4);
    }
    result_45.m_backend.exp = local_1b08.exp;
    result_45.m_backend.neg = local_1b08.neg;
    result_45.m_backend.fpclass = local_1b08.fpclass;
    result_45.m_backend.prec_elem = local_1b08.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
              (&result_45.m_backend,&local_1908);
    if (result_45.m_backend.fpclass == cpp_dec_float_NaN) {
LAB_0056d93e:
      puVar27 = (undefined8 *)__cxa_allocate_exception(0x28);
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_1d58;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&ptr,"XMAISM12 This should never happen.","");
      *puVar27 = &PTR__SPxException_0069d438;
      puVar27[1] = puVar27 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar27 + 1),
                 ptr.
                 super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,(long)&(ptr.
                                 super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi)->_vptr__Sp_counted_base +
                         (long)ptr.
                               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
      *puVar27 = &PTR__SPxException_0069d410;
      __cxa_throw(puVar27,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    local_1cf0._0_4_ = cpp_dec_float_finite;
    local_1cf0._4_4_ = 0x1c;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1d58 = (undefined1  [16])0x0;
    local_1d48 = (undefined1  [16])0x0;
    local_1d38 = (undefined1  [16])0x0;
    local_1d28 = (undefined1  [16])0x0;
    local_1d18 = (undefined1  [16])0x0;
    local_1d08[0] = 0;
    local_1d08[1] = 0;
    stack0xffffffffffffe300 = 0;
    uStack_1cfb = 0;
    iStack_1cf8 = 0;
    bStack_1cf4 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&ptr,0.0);
    iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       (&result_45.m_backend,(cpp_dec_float<200U,_int,_void> *)&ptr);
    if (-1 < iVar25) goto LAB_0056d93e;
    ::soplex::infinity::__tls_init();
    result_45.m_backend.fpclass = cpp_dec_float_finite;
    result_45.m_backend.prec_elem = 0x1c;
    result_45.m_backend.data._M_elems[0] = 0;
    result_45.m_backend.data._M_elems[1] = 0;
    result_45.m_backend.data._M_elems[2] = 0;
    result_45.m_backend.data._M_elems[3] = 0;
    result_45.m_backend.data._M_elems[4] = 0;
    result_45.m_backend.data._M_elems[5] = 0;
    result_45.m_backend.data._M_elems[6] = 0;
    result_45.m_backend.data._M_elems[7] = 0;
    result_45.m_backend.data._M_elems[8] = 0;
    result_45.m_backend.data._M_elems[9] = 0;
    result_45.m_backend.data._M_elems[10] = 0;
    result_45.m_backend.data._M_elems[0xb] = 0;
    result_45.m_backend.data._M_elems[0xc] = 0;
    result_45.m_backend.data._M_elems[0xd] = 0;
    result_45.m_backend.data._M_elems[0xe] = 0;
    result_45.m_backend.data._M_elems[0xf] = 0;
    result_45.m_backend.data._M_elems[0x10] = 0;
    result_45.m_backend.data._M_elems[0x11] = 0;
    result_45.m_backend.data._M_elems[0x12] = 0;
    result_45.m_backend.data._M_elems[0x13] = 0;
    result_45.m_backend.data._M_elems[0x14] = 0;
    result_45.m_backend.data._M_elems[0x15] = 0;
    result_45.m_backend.data._M_elems[0x16] = 0;
    result_45.m_backend.data._M_elems[0x17] = 0;
    result_45.m_backend.data._M_elems[0x18] = 0;
    result_45.m_backend.data._M_elems[0x19] = 0;
    result_45.m_backend.data._M_elems._104_5_ = 0;
    result_45.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_45.m_backend.exp = 0;
    result_45.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&result_45,a);
    if (((local_1508.fpclass == cpp_dec_float_NaN) ||
        (result_45.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_1508,&result_45.m_backend), 0 < iVar25)) {
      pnVar38 = &result_46;
      pcVar37 = &result_49.m_backend;
      for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
        (pcVar37->data)._M_elems[0] = (pnVar38->m_backend).data._M_elems[0];
        pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
        pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar51 * -8 + 4);
      }
      result_49.m_backend.exp = result_46.m_backend.exp;
      result_49.m_backend.neg = result_46.m_backend.neg;
      result_49.m_backend.fpclass = result_46.m_backend.fpclass;
      result_49.m_backend.prec_elem = result_46.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&result_49.m_backend,&scale2.m_backend);
      local_1cf0._0_4_ = cpp_dec_float_finite;
      local_1cf0._4_4_ = 0x1c;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )ZEXT816(0);
      local_1d58 = ZEXT816(0);
      local_1d48 = ZEXT816(0);
      local_1d38 = ZEXT816(0);
      local_1d28 = ZEXT816(0);
      local_1d18 = ZEXT816(0);
      local_1d08[0] = 0;
      local_1d08[1] = 0;
      stack0xffffffffffffe300 = 0;
      uStack_1cfb = 0;
      iStack_1cf8 = 0;
      bStack_1cf4 = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)&ptr,&result_49.m_backend,&local_1b08);
    }
    else {
      ::soplex::infinity::__tls_init();
      local_1cf0._0_4_ = cpp_dec_float_finite;
      local_1cf0._4_4_ = 0x1c;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )ZEXT816(0);
      local_1d58 = ZEXT816(0);
      local_1d48 = ZEXT816(0);
      local_1d38 = ZEXT816(0);
      local_1d28 = ZEXT816(0);
      local_1d18 = ZEXT816(0);
      local_1d08[0] = 0;
      local_1d08[1] = 0;
      stack0xffffffffffffe300 = 0;
      uStack_1cfb = 0;
      iStack_1cf8 = 0;
      bStack_1cf4 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&ptr,a);
    }
    psVar35 = &ptr;
    puVar40 = (undefined4 *)local_1808;
    for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
      *puVar40 = *(undefined4 *)
                  &(psVar35->
                   super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
      psVar35 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                 *)((long)psVar35 + (ulong)bVar51 * -8 + 4);
      puVar40 = puVar40 + (ulong)bVar51 * -2 + 1;
    }
    iStack_1798 = iStack_1cf8;
    bStack_1794 = bStack_1cf4;
    local_1790._0_4_ = (fpclass_type)local_1cf0;
    local_1790._4_4_ = local_1cf0._4_4_;
    ::soplex::infinity::__tls_init();
    result_45.m_backend.fpclass = cpp_dec_float_finite;
    result_45.m_backend.prec_elem = 0x1c;
    result_45.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_45.m_backend.data._M_elems._16_16_ = ZEXT816(0);
    result_45.m_backend.data._M_elems._32_16_ = ZEXT816(0);
    result_45.m_backend.data._M_elems._48_16_ = ZEXT816(0);
    result_45.m_backend.data._M_elems._64_16_ = ZEXT816(0);
    result_45.m_backend.data._M_elems._80_16_ = ZEXT816(0);
    result_45.m_backend.data._M_elems[0x18] = 0;
    result_45.m_backend.data._M_elems[0x19] = 0;
    result_45.m_backend.data._M_elems._104_5_ = 0;
    result_45.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_45.m_backend.exp = 0;
    result_45.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&result_45,dVar52);
    if (((local_1588.fpclass == cpp_dec_float_NaN) ||
        (result_45.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_1588,&result_45.m_backend), iVar25 < 0)) {
      pnVar38 = &result_2;
      pnVar43 = &result_49;
      for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
        (pnVar43->m_backend).data._M_elems[0] = (pnVar38->m_backend).data._M_elems[0];
        pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
        pnVar43 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar43 + ((ulong)bVar51 * -2 + 1) * 4);
      }
      result_49.m_backend.exp = result_2.m_backend.exp;
      result_49.m_backend.neg = result_2.m_backend.neg;
      result_49.m_backend.fpclass = result_2.m_backend.fpclass;
      result_49.m_backend.prec_elem = result_2.m_backend.prec_elem;
      pcVar37 = &scale1.m_backend;
      goto LAB_0056d352;
    }
  }
  else {
    local_1cf0._0_4_ = cpp_dec_float_finite;
    local_1cf0._4_4_ = 0x1c;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1d58 = (undefined1  [16])0x0;
    local_1d48 = (undefined1  [16])0x0;
    local_1d38 = (undefined1  [16])0x0;
    local_1d28 = (undefined1  [16])0x0;
    local_1d18 = (undefined1  [16])0x0;
    local_1d08[0] = 0;
    local_1d08[1] = 0;
    stack0xffffffffffffe300 = 0;
    uStack_1cfb = 0;
    iStack_1cf8 = 0;
    bStack_1cf4 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&ptr,0.0);
    iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       (&result_45.m_backend,(cpp_dec_float<200U,_int,_void> *)&ptr);
    if (iVar25 < 1) goto LAB_0056cf4e;
    ::soplex::infinity::__tls_init();
    result_45.m_backend.fpclass = cpp_dec_float_finite;
    result_45.m_backend.prec_elem = 0x1c;
    result_45.m_backend.data._M_elems[0] = 0;
    result_45.m_backend.data._M_elems[1] = 0;
    result_45.m_backend.data._M_elems[2] = 0;
    result_45.m_backend.data._M_elems[3] = 0;
    result_45.m_backend.data._M_elems[4] = 0;
    result_45.m_backend.data._M_elems[5] = 0;
    result_45.m_backend.data._M_elems[6] = 0;
    result_45.m_backend.data._M_elems[7] = 0;
    result_45.m_backend.data._M_elems[8] = 0;
    result_45.m_backend.data._M_elems[9] = 0;
    result_45.m_backend.data._M_elems[10] = 0;
    result_45.m_backend.data._M_elems[0xb] = 0;
    result_45.m_backend.data._M_elems[0xc] = 0;
    result_45.m_backend.data._M_elems[0xd] = 0;
    result_45.m_backend.data._M_elems[0xe] = 0;
    result_45.m_backend.data._M_elems[0xf] = 0;
    result_45.m_backend.data._M_elems[0x10] = 0;
    result_45.m_backend.data._M_elems[0x11] = 0;
    result_45.m_backend.data._M_elems[0x12] = 0;
    result_45.m_backend.data._M_elems[0x13] = 0;
    result_45.m_backend.data._M_elems[0x14] = 0;
    result_45.m_backend.data._M_elems[0x15] = 0;
    result_45.m_backend.data._M_elems[0x16] = 0;
    result_45.m_backend.data._M_elems[0x17] = 0;
    result_45.m_backend.data._M_elems[0x18] = 0;
    result_45.m_backend.data._M_elems[0x19] = 0;
    result_45.m_backend.data._M_elems._104_5_ = 0;
    result_45.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_45.m_backend.exp = 0;
    result_45.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&result_45,dVar52);
    if (((local_1588.fpclass == cpp_dec_float_NaN) ||
        (result_45.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_1588,&result_45.m_backend), iVar25 < 0)) {
      pnVar38 = &result_2;
      pcVar37 = &result_49.m_backend;
      for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
        (pcVar37->data)._M_elems[0] = (pnVar38->m_backend).data._M_elems[0];
        pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
        pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar51 * -8 + 4);
      }
      result_49.m_backend.exp = result_2.m_backend.exp;
      result_49.m_backend.neg = result_2.m_backend.neg;
      result_49.m_backend.fpclass = result_2.m_backend.fpclass;
      result_49.m_backend.prec_elem = result_2.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&result_49.m_backend,&scale1.m_backend);
      local_1cf0._0_4_ = cpp_dec_float_finite;
      local_1cf0._4_4_ = 0x1c;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )ZEXT816(0);
      local_1d58 = ZEXT816(0);
      local_1d48 = ZEXT816(0);
      local_1d38 = ZEXT816(0);
      local_1d28 = ZEXT816(0);
      local_1d18 = ZEXT816(0);
      local_1d08[0] = 0;
      local_1d08[1] = 0;
      stack0xffffffffffffe300 = 0;
      uStack_1cfb = 0;
      iStack_1cf8 = 0;
      bStack_1cf4 = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)&ptr,&result_49.m_backend,&local_1b08);
    }
    else {
      ::soplex::infinity::__tls_init();
      local_1cf0._0_4_ = cpp_dec_float_finite;
      local_1cf0._4_4_ = 0x1c;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )ZEXT816(0);
      local_1d58 = ZEXT816(0);
      local_1d48 = ZEXT816(0);
      local_1d38 = ZEXT816(0);
      local_1d28 = ZEXT816(0);
      local_1d18 = ZEXT816(0);
      local_1d08[0] = 0;
      local_1d08[1] = 0;
      stack0xffffffffffffe300 = 0;
      uStack_1cfb = 0;
      iStack_1cf8 = 0;
      bStack_1cf4 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&ptr,a);
    }
    psVar35 = &ptr;
    puVar40 = (undefined4 *)local_1808;
    for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
      *puVar40 = *(undefined4 *)
                  &(psVar35->
                   super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
      psVar35 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                 *)((long)psVar35 + (ulong)bVar51 * -8 + 4);
      puVar40 = puVar40 + (ulong)bVar51 * -2 + 1;
    }
    iStack_1798 = iStack_1cf8;
    bStack_1794 = bStack_1cf4;
    local_1790._0_4_ = (fpclass_type)local_1cf0;
    local_1790._4_4_ = local_1cf0._4_4_;
    ::soplex::infinity::__tls_init();
    result_45.m_backend.fpclass = cpp_dec_float_finite;
    result_45.m_backend.prec_elem = 0x1c;
    result_45.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_45.m_backend.data._M_elems._16_16_ = ZEXT816(0);
    result_45.m_backend.data._M_elems._32_16_ = ZEXT816(0);
    result_45.m_backend.data._M_elems._48_16_ = ZEXT816(0);
    result_45.m_backend.data._M_elems._64_16_ = ZEXT816(0);
    result_45.m_backend.data._M_elems._80_16_ = ZEXT816(0);
    result_45.m_backend.data._M_elems[0x18] = 0;
    result_45.m_backend.data._M_elems[0x19] = 0;
    result_45.m_backend.data._M_elems._104_5_ = 0;
    result_45.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_45.m_backend.exp = 0;
    result_45.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&result_45,a);
    if (((local_1508.fpclass == cpp_dec_float_NaN) ||
        (result_45.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_1508,&result_45.m_backend), 0 < iVar25)) {
      pnVar38 = &result_46;
      pnVar43 = &result_49;
      for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
        (pnVar43->m_backend).data._M_elems[0] = (pnVar38->m_backend).data._M_elems[0];
        pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
        pnVar43 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar43 + ((ulong)bVar51 * -2 + 1) * 4);
      }
      result_49.m_backend.exp = result_46.m_backend.exp;
      result_49.m_backend.neg = result_46.m_backend.neg;
      result_49.m_backend.fpclass = result_46.m_backend.fpclass;
      result_49.m_backend.prec_elem = result_46.m_backend.prec_elem;
      pcVar37 = &scale2.m_backend;
LAB_0056d352:
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&result_49.m_backend,pcVar37);
      local_1cf0._0_4_ = cpp_dec_float_finite;
      local_1cf0._4_4_ = 0x1c;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )ZEXT816(0);
      local_1d58 = ZEXT816(0);
      local_1d48 = ZEXT816(0);
      local_1d38 = ZEXT816(0);
      local_1d28 = ZEXT816(0);
      local_1d18 = ZEXT816(0);
      local_1d08[0] = 0;
      local_1d08[1] = 0;
      stack0xffffffffffffe300 = 0;
      uStack_1cfb = 0;
      iStack_1cf8 = 0;
      bStack_1cf4 = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)&ptr,&result_49.m_backend,&local_1b08);
      goto LAB_0056d433;
    }
  }
  ::soplex::infinity::__tls_init();
  local_1cf0._0_4_ = cpp_dec_float_finite;
  local_1cf0._4_4_ = 0x1c;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
       = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
          )ZEXT816(0);
  local_1d58 = ZEXT816(0);
  local_1d48 = ZEXT816(0);
  local_1d38 = ZEXT816(0);
  local_1d28 = ZEXT816(0);
  local_1d18 = ZEXT816(0);
  local_1d08[0] = 0;
  local_1d08[1] = 0;
  stack0xffffffffffffe300 = 0;
  uStack_1cfb = 0;
  iStack_1cf8 = 0;
  bStack_1cf4 = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&ptr,dVar52);
LAB_0056d433:
  psVar35 = &ptr;
  puVar40 = (undefined4 *)local_1888;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    *puVar40 = *(undefined4 *)
                &(psVar35->
                 super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
    psVar35 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
               *)((long)psVar35 + (ulong)bVar51 * -8 + 4);
    puVar40 = puVar40 + (ulong)bVar51 * -2 + 1;
  }
  iStack_1818 = iStack_1cf8;
  bStack_1814 = bStack_1cf4;
  local_1810._0_4_ = (fpclass_type)local_1cf0;
  local_1810._4_4_ = local_1cf0._4_4_;
  pcVar37 = &local_1608;
  pnVar38 = &result_45;
  for (lVar30 = 0x1c; bVar23 = local_1608.neg, iVar26 = local_1608.exp, uVar21 = local_1788._120_8_,
      bVar3 = local_1788.neg, iVar6 = local_1788.exp, uVar20 = local_1790, bVar24 = bStack_1794,
      iVar25 = iStack_1798, lVar30 != 0; lVar30 = lVar30 + -1) {
    (pnVar38->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
    pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
    pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
  }
  fVar44 = local_1608.fpclass;
  iVar5 = local_1608.prec_elem;
  pcVar37 = &local_1788;
  pnVar38 = &result_49;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    (pnVar38->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
    pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
    pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
  }
  puVar36 = (uint *)local_1808;
  puVar41 = local_790;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    *puVar41 = *puVar36;
    puVar36 = puVar36 + (ulong)bVar51 * -2 + 1;
    puVar41 = puVar41 + (ulong)bVar51 * -2 + 1;
  }
  pcVar37 = &local_1608;
  pcVar42 = &local_130;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    (pcVar42->data)._M_elems[0] = (pcVar37->data)._M_elems[0];
    pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
    pcVar42 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar42 + (ulong)bVar51 * -8 + 4);
  }
  local_130.exp = local_1608.exp;
  local_130.neg = local_1608.neg;
  local_130.fpclass = local_1608.fpclass;
  local_130.prec_elem = local_1608.prec_elem;
  epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_1290,this);
  puVar36 = local_790;
  pcVar37 = (cpp_dec_float<200U,_int,_void> *)&ptr;
  for (lVar30 = 0x1c; uVar22 = local_1790, lVar30 != 0; lVar30 = lVar30 + -1) {
    (pcVar37->data)._M_elems[0] = *puVar36;
    puVar36 = puVar36 + (ulong)bVar51 * -2 + 1;
    pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar51 * -8 + 4);
  }
  iStack_1cf8 = iVar25;
  bStack_1cf4 = bVar24;
  local_1790._0_4_ = (fpclass_type)uVar20;
  local_1790._4_4_ = SUB84(uVar20,4);
  local_1cf0._0_4_ = (fpclass_type)local_1790;
  local_1cf0._4_4_ = local_1790._4_4_;
  local_1790 = uVar22;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
            ((cpp_dec_float<200U,_int,_void> *)&ptr,&local_130);
  if ((((fpclass_type)local_1cf0 != cpp_dec_float_NaN) && (local_1290.fpclass != cpp_dec_float_NaN))
     && (iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)&ptr,&local_1290), 0 < iVar25)) {
    (*(lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x2a])(lp,(ulong)local_1dcc,local_1808,0);
    piVar19 = &(this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_chgBnds;
    *piVar19 = *piVar19 + 1;
  }
  puVar36 = (uint *)local_1888;
  pnVar38 = &local_1b0;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    (pnVar38->m_backend).data._M_elems[0] = *puVar36;
    puVar36 = puVar36 + (ulong)bVar51 * -2 + 1;
    pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
  }
  local_1b0.m_backend.exp = iStack_1818;
  local_1b0.m_backend.neg = bStack_1814;
  local_1b0.m_backend.fpclass = (fpclass_type)local_1810;
  local_1b0.m_backend.prec_elem = local_1810._4_4_;
  pcVar37 = &local_1788;
  pnVar38 = &local_230;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    (pnVar38->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
    pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
    pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
  }
  local_230.m_backend.exp = local_1788.exp;
  local_230.m_backend.neg = local_1788.neg;
  local_230.m_backend.fpclass = local_1788.fpclass;
  local_230.m_backend.prec_elem = local_1788.prec_elem;
  epsZero(&local_2b0,this);
  bVar24 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     (&local_1b0,&local_230,&local_2b0);
  if (bVar24) {
    (*(lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x2d])(lp,(ulong)local_1dcc,local_1888,0);
    piVar19 = &(this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_chgBnds;
    *piVar19 = *piVar19 + 1;
  }
  this_00 = (AggregationPS *)operator_new(0x378);
  uVar20 = local_1788._120_8_;
  iVar25 = *i;
  pcVar37 = &local_1488;
  pnVar38 = &local_f10;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    (pnVar38->m_backend).data._M_elems[0] = (pcVar37->data)._M_elems[0];
    pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + ((ulong)bVar51 * -2 + 1) * 4);
    pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
  }
  local_f10.m_backend.exp = local_1488.exp;
  local_f10.m_backend.neg = local_1488.neg;
  local_f10.m_backend.fpclass = local_1488.fpclass;
  local_f10.m_backend.prec_elem = local_1488.prec_elem;
  pnVar38 = &result_49;
  pnVar43 = &local_f90;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    (pnVar43->m_backend).data._M_elems[0] = (pnVar38->m_backend).data._M_elems[0];
    pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
    pnVar43 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar43 + ((ulong)bVar51 * -2 + 1) * 4);
  }
  local_f90.m_backend.exp = iVar6;
  local_f90.m_backend.neg = bVar3;
  local_1788.fpclass = (fpclass_type)uVar21;
  local_1788.prec_elem = SUB84(uVar21,4);
  local_f90.m_backend.fpclass = local_1788.fpclass;
  local_f90.m_backend.prec_elem = local_1788.prec_elem;
  pnVar38 = &result_45;
  pnVar43 = &local_330;
  for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
    (pnVar43->m_backend).data._M_elems[0] = (pnVar38->m_backend).data._M_elems[0];
    pnVar38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar38 + ((ulong)bVar51 * -2 + 1) * 4);
    pnVar43 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar43 + ((ulong)bVar51 * -2 + 1) * 4);
  }
  local_330.m_backend.exp = iVar26;
  local_330.m_backend.neg = bVar23;
  local_330.m_backend.fpclass = fVar44;
  local_330.m_backend.prec_elem = iVar5;
  local_1b98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1b98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_1b98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1b98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1b98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1b98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1b98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_1788._120_8_ = uVar20;
  AggregationPS::AggregationPS
            (this_00,lp,iVar25,local_1dd0,&local_f10,&local_f90,&local_330,&local_1b98);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::AggregationPS*>
            (&ptr.
              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,this_00);
  if (local_1b98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
  ::push_back(&(this->m_hist).data,&ptr);
  piVar19 = (this->m_rIdx).data;
  piVar19[*i] = piVar19[(long)(lp->
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set.thenum + -1];
  (*(lp->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0xf])(lp);
  piVar19 = (this->m_cIdx).data;
  piVar19[lVar29] =
       piVar19[(long)(lp->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum + -1];
  (*(lp->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x15])(lp,(ulong)local_1dd0);
  uVar1 = (this->
          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).m_remRows;
  uVar2 = (this->
          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).m_remCols;
  (this->
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_remRows = uVar1 + 1;
  (this->
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_remCols = uVar2 + 1;
  piVar19 = &(this->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).m_remNzos;
  *piVar19 = *piVar19 + 2;
  piVar19 = (this->m_stat).data + 0xf;
  *piVar19 = *piVar19 + 1;
  if (ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return OKAY;
code_r0x0056c320:
  lVar32 = lVar32 + 0x84;
  if (lVar31 * 0x84 == lVar32) goto LAB_0056c37a;
  goto LAB_0056c316;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::aggregateVars(SPxLPBase<R>& lp,
      const SVectorBase<R>& row, int& i)
{
   assert(row.size() == 2);
   assert(EQrel(lp.lhs(i), lp.rhs(i), feastol()));

   R rhs = lp.rhs(i);
   assert(rhs < R(infinity) && rhs > R(-infinity));

   int j = row.index(0);
   int k = row.index(1);
   R aij = row.value(0);
   R aik = row.value(1);
   R lower_j = lp.lower(j);
   R upper_j = lp.upper(j);
   R lower_k = lp.lower(k);
   R upper_k = lp.upper(k);

   // fixed variables should be removed by simplifyCols()
   if(EQrel(lower_j, upper_j, feastol()) || EQrel(lower_k, upper_k, feastol()))
      return this->OKAY;

   assert(isNotZero(aij, this->epsZero()) && isNotZero(aik, this->epsZero()));

   SPxOut::debug(this, "IMAISM23 row {}: doubleton equation -> {} x_{} + {} x_{} = {}", i, aij, j, aik,
                 k, rhs);

   // determine which variable can be aggregated without requiring bound tightening of the other variable
   R new_lo_j;
   R new_up_j;
   R new_lo_k;
   R new_up_k;

   if(aij * aik < 0.0)
   {
      // orientation persists
      new_lo_j = (upper_k >=  R(infinity)) ? R(-infinity) : (rhs - aik * upper_k) / aij;
      new_up_j = (lower_k <= R(-infinity)) ?  R(infinity) : (rhs - aik * lower_k) / aij;
      new_lo_k = (upper_j >=  R(infinity)) ? R(-infinity) : (rhs - aij * upper_j) / aik;
      new_up_k = (lower_j <= R(-infinity)) ?  R(infinity) : (rhs - aij * lower_j) / aik;
   }
   else if(aij * aik > 0.0)
   {
      // orientation is reversed
      new_lo_j = (lower_k <= R(-infinity)) ? R(-infinity) : (rhs - aik * lower_k) / aij;
      new_up_j = (upper_k >=  R(infinity)) ?  R(infinity) : (rhs - aik * upper_k) / aij;
      new_lo_k = (lower_j <= R(-infinity)) ? R(-infinity) : (rhs - aij * lower_j) / aik;
      new_up_k = (upper_j >=  R(infinity)) ?  R(infinity) : (rhs - aij * upper_j) / aik;
   }
   else
      throw SPxInternalCodeException("XMAISM12 This should never happen.");

   bool flip_jk = false;

   if(new_lo_j <= R(-infinity) && new_up_j >= R(infinity))
   {
      // no bound tightening on x_j when x_k is aggregated
      flip_jk = true;
   }
   else if(new_lo_k <= R(-infinity) && new_up_k >= R(infinity))
   {
      // no bound tightening on x_k when x_j is aggregated
      flip_jk = false;
   }
   else if(LE(new_lo_j, lower_j, this->tolerances()->epsilon())
           && GE(new_up_j, upper_j, this->tolerances()->epsilon()))
   {
      if(LE(new_lo_k, lower_k, this->tolerances()->epsilon())
            && GE(new_up_k, upper_k, this->tolerances()->epsilon()))
      {
         // both variables' bounds are not affected by aggregation; choose the better aggregation coeff (aik/aij)
         if(spxAbs(aij) > spxAbs(aik))
            flip_jk = false;
         else
            flip_jk = true;
      }
      else
         flip_jk = false;
   }
   else if(LE(new_lo_k, lower_k, this->tolerances()->epsilon())
           && GE(new_up_k, upper_k, this->tolerances()->epsilon()))
   {
      flip_jk = true;
   }
   else
   {
      if(spxAbs(aij) > spxAbs(aik))
         flip_jk = false;
      else
         flip_jk = true;
   }

   if(flip_jk)
   {
      int _j = j;
      R _aij = aij;
      R _lower_j = lower_j;
      R _upper_j = upper_j;
      j = k;
      k = _j;
      aij = aik;
      aik = _aij;
      lower_j = lower_k;
      lower_k = _lower_j;
      upper_j = upper_k;
      upper_k = _upper_j;
   }

   const SVectorBase<R>& col_j = lp.colVector(j);
   const SVectorBase<R>& col_k = lp.colVector(k);

   // aggregation coefficients (x_j = aggr_coef * x_k + aggr_const)
   R aggr_coef = - (aik / aij);
   R aggr_const = rhs / aij;

   SPxOut::debug(this, " removed, replacing x_{} with {} + {} * x_{}\n", j, aggr_const, aggr_coef, k);

   // replace all occurrences of x_j
   for(int r = 0; r < col_j.size(); ++r)
   {
      int row_r = col_j.index(r);
      R arj = col_j.value(r);

      // skip row i
      if(row_r == i)
         continue;

      // adapt sides of row r
      R lhs_r = lp.lhs(row_r);
      R rhs_r = lp.rhs(row_r);

      if(lhs_r > R(-infinity))
      {
         lp.changeLhs(row_r, lhs_r - aggr_const * arj);
         this->m_chgLRhs++;
      }

      if(rhs_r < R(infinity))
      {
         lp.changeRhs(row_r, rhs_r - aggr_const * arj);
         this->m_chgLRhs++;
      }

      R newcoef = aggr_coef * arj;
      int pos_rk = col_k.pos(row_r);

      // check whether x_k is also present in row r and get its coefficient
      if(pos_rk >= 0)
      {
         R ark = col_k.value(pos_rk);
         newcoef += ark;
         this->m_remNzos++;
      }

      // add new column k to row r or adapt the coefficient a_rk
      lp.changeElement(row_r, k, newcoef);
   }

   // adapt objective function
   R obj_j = lp.obj(j);

   if(isNotZero(obj_j, this->epsZero()))
   {
      this->addObjoffset(aggr_const * obj_j);
      R obj_k = lp.obj(k);
      lp.changeObj(k, obj_k + aggr_coef * obj_j);
   }

   // adapt bounds of x_k
   R scale1 = maxAbs(rhs, aij * upper_j);
   R scale2 = maxAbs(rhs, aij * lower_j);

   if(scale1 < 1.0)
      scale1 = 1.0;

   if(scale2 < 1.0)
      scale2 = 1.0;

   R z1 = (rhs / scale1) - (aij * upper_j / scale1);
   R z2 = (rhs / scale2) - (aij * lower_j / scale2);

   // just some rounding
   if(isZero(z1, this->epsZero()))
      z1 = 0.0;

   if(isZero(z2, this->epsZero()))
      z2 = 0.0;

   // determine which side has to be used for the bounds comparison below
   if(aik * aij > 0.0)
   {
      new_lo_k = (upper_j >=  R(infinity)) ? R(-infinity) : z1 * scale1 / aik;
      new_up_k = (lower_j <= R(-infinity)) ?  R(infinity) : z2 * scale2 / aik;
   }
   else if(aik * aij < 0.0)
   {
      new_lo_k = (lower_j <= R(-infinity)) ? R(-infinity) : z2 * scale2 / aik;
      new_up_k = (upper_j >=  R(infinity)) ?  R(infinity) : z1 * scale1 / aik;
   }
   else
      throw SPxInternalCodeException("XMAISM12 This should never happen.");

   // change bounds of x_k if the new ones are tighter
   R oldlower_k = lower_k;
   R oldupper_k = upper_k;

   if(GT(new_lo_k, lower_k, this->epsZero()))
   {
      lp.changeLower(k, new_lo_k);
      this->m_chgBnds++;
   }

   if(LT(new_up_k, upper_k, this->epsZero()))
   {
      lp.changeUpper(k, new_up_k);
      this->m_chgBnds++;
   }

   std::shared_ptr<PostStep> ptr(new AggregationPS(lp, i, j, rhs, oldupper_k, oldlower_k,
                                 this->_tolerances));
   m_hist.append(ptr);

   removeRow(lp, i);
   removeCol(lp, j);

   this->m_remRows++;
   this->m_remCols++;
   this->m_remNzos += 2;

   ++m_stat[AGGREGATION];

   return this->OKAY;
}